

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  long lVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  byte bVar80;
  byte bVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  ulong uVar87;
  long lVar88;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar95;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ulong uVar89;
  Primitive *pPVar90;
  uint uVar91;
  ulong uVar92;
  byte bVar93;
  float fVar94;
  float fVar144;
  float fVar145;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar101 [16];
  float fVar146;
  float fVar148;
  float fVar149;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar147;
  float fVar150;
  float fVar151;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar152;
  undefined4 uVar153;
  undefined8 uVar154;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  float fVar175;
  float fVar176;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar180;
  undefined1 auVar179 [64];
  float fVar195;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar193;
  float fVar194;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_64c;
  Precalculations *local_648;
  RayHit *local_640;
  RayQueryContext *local_638;
  Primitive *local_630;
  ulong local_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  uint local_580;
  undefined4 uStack_57c;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined4 local_568;
  float local_564;
  undefined4 local_560;
  uint local_55c;
  undefined4 local_558;
  uint local_554;
  uint local_550;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [8];
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined8 local_440;
  undefined8 uStack_438;
  RTCRayQueryContext *local_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  int local_31c;
  undefined1 local_310 [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  byte local_2d0;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar10 = prim[1];
  uVar89 = (ulong)(byte)PVar10;
  lVar74 = uVar89 * 0x19;
  fVar176 = *(float *)(prim + lVar74 + 0x12);
  auVar164 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar74 + 6));
  fVar175 = fVar176 * auVar164._0_4_;
  fVar152 = fVar176 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar89 * 4 + 6);
  auVar109 = vpmovsxbd_avx2(auVar98);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar89 * 5 + 6);
  auVar107 = vpmovsxbd_avx2(auVar96);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar89 * 6 + 6);
  auVar120 = vpmovsxbd_avx2(auVar103);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar89 * 0xb + 6);
  auVar119 = vpmovsxbd_avx2(auVar102);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6);
  auVar113 = vpmovsxbd_avx2(auVar6);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar110 = vcvtdq2ps_avx(auVar113);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (uint)(byte)PVar10 * 0xc + uVar89 + 6);
  auVar108 = vpmovsxbd_avx2(auVar7);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar92 = (ulong)(uint)((int)(uVar89 * 9) * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar118 = vpmovsxbd_avx2(auVar8);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar92 + uVar89 + 6);
  auVar117 = vpmovsxbd_avx2(auVar97);
  auVar117 = vcvtdq2ps_avx(auVar117);
  uVar82 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar106 = vpmovsxbd_avx2(auVar9);
  auVar112 = vcvtdq2ps_avx(auVar106);
  auVar209._4_4_ = fVar152;
  auVar209._0_4_ = fVar152;
  auVar209._8_4_ = fVar152;
  auVar209._12_4_ = fVar152;
  auVar209._16_4_ = fVar152;
  auVar209._20_4_ = fVar152;
  auVar209._24_4_ = fVar152;
  auVar209._28_4_ = fVar152;
  auVar211._8_4_ = 1;
  auVar211._0_8_ = 0x100000001;
  auVar211._12_4_ = 1;
  auVar211._16_4_ = 1;
  auVar211._20_4_ = 1;
  auVar211._24_4_ = 1;
  auVar211._28_4_ = 1;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar114 = ZEXT1632(CONCAT412(fVar176 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar176 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar176 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar152))));
  auVar111 = vpermps_avx2(auVar211,auVar114);
  auVar105 = vpermps_avx512vl(auVar104,auVar114);
  fVar152 = auVar105._0_4_;
  fVar193 = auVar105._4_4_;
  auVar114._4_4_ = fVar193 * auVar120._4_4_;
  auVar114._0_4_ = fVar152 * auVar120._0_4_;
  fVar194 = auVar105._8_4_;
  auVar114._8_4_ = fVar194 * auVar120._8_4_;
  fVar195 = auVar105._12_4_;
  auVar114._12_4_ = fVar195 * auVar120._12_4_;
  fVar180 = auVar105._16_4_;
  auVar114._16_4_ = fVar180 * auVar120._16_4_;
  fVar94 = auVar105._20_4_;
  auVar114._20_4_ = fVar94 * auVar120._20_4_;
  fVar95 = auVar105._24_4_;
  auVar114._24_4_ = fVar95 * auVar120._24_4_;
  auVar114._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar108._4_4_ * fVar193;
  auVar113._0_4_ = auVar108._0_4_ * fVar152;
  auVar113._8_4_ = auVar108._8_4_ * fVar194;
  auVar113._12_4_ = auVar108._12_4_ * fVar195;
  auVar113._16_4_ = auVar108._16_4_ * fVar180;
  auVar113._20_4_ = auVar108._20_4_ * fVar94;
  auVar113._24_4_ = auVar108._24_4_ * fVar95;
  auVar113._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar112._4_4_ * fVar193;
  auVar106._0_4_ = auVar112._0_4_ * fVar152;
  auVar106._8_4_ = auVar112._8_4_ * fVar194;
  auVar106._12_4_ = auVar112._12_4_ * fVar195;
  auVar106._16_4_ = auVar112._16_4_ * fVar180;
  auVar106._20_4_ = auVar112._20_4_ * fVar94;
  auVar106._24_4_ = auVar112._24_4_ * fVar95;
  auVar106._28_4_ = auVar105._28_4_;
  auVar98 = vfmadd231ps_fma(auVar114,auVar111,auVar107);
  auVar96 = vfmadd231ps_fma(auVar113,auVar111,auVar110);
  auVar103 = vfmadd231ps_fma(auVar106,auVar117,auVar111);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar209,auVar109);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar209,auVar119);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar118,auVar209);
  auVar210._4_4_ = fVar175;
  auVar210._0_4_ = fVar175;
  auVar210._8_4_ = fVar175;
  auVar210._12_4_ = fVar175;
  auVar210._16_4_ = fVar175;
  auVar210._20_4_ = fVar175;
  auVar210._24_4_ = fVar175;
  auVar210._28_4_ = fVar175;
  auVar106 = ZEXT1632(CONCAT412(fVar176 * auVar164._12_4_,
                                CONCAT48(fVar176 * auVar164._8_4_,
                                         CONCAT44(fVar176 * auVar164._4_4_,fVar175))));
  auVar113 = vpermps_avx2(auVar211,auVar106);
  auVar106 = vpermps_avx512vl(auVar104,auVar106);
  fVar176 = auVar106._0_4_;
  fVar152 = auVar106._4_4_;
  auVar111._4_4_ = fVar152 * auVar120._4_4_;
  auVar111._0_4_ = fVar176 * auVar120._0_4_;
  fVar193 = auVar106._8_4_;
  auVar111._8_4_ = fVar193 * auVar120._8_4_;
  fVar194 = auVar106._12_4_;
  auVar111._12_4_ = fVar194 * auVar120._12_4_;
  fVar195 = auVar106._16_4_;
  auVar111._16_4_ = fVar195 * auVar120._16_4_;
  fVar180 = auVar106._20_4_;
  auVar111._20_4_ = fVar180 * auVar120._20_4_;
  fVar94 = auVar106._24_4_;
  auVar111._24_4_ = fVar94 * auVar120._24_4_;
  auVar111._28_4_ = 1;
  auVar104._4_4_ = auVar108._4_4_ * fVar152;
  auVar104._0_4_ = auVar108._0_4_ * fVar176;
  auVar104._8_4_ = auVar108._8_4_ * fVar193;
  auVar104._12_4_ = auVar108._12_4_ * fVar194;
  auVar104._16_4_ = auVar108._16_4_ * fVar195;
  auVar104._20_4_ = auVar108._20_4_ * fVar180;
  auVar104._24_4_ = auVar108._24_4_ * fVar94;
  auVar104._28_4_ = auVar120._28_4_;
  auVar108._4_4_ = auVar112._4_4_ * fVar152;
  auVar108._0_4_ = auVar112._0_4_ * fVar176;
  auVar108._8_4_ = auVar112._8_4_ * fVar193;
  auVar108._12_4_ = auVar112._12_4_ * fVar194;
  auVar108._16_4_ = auVar112._16_4_ * fVar195;
  auVar108._20_4_ = auVar112._20_4_ * fVar180;
  auVar108._24_4_ = auVar112._24_4_ * fVar94;
  auVar108._28_4_ = auVar106._28_4_;
  auVar102 = vfmadd231ps_fma(auVar111,auVar113,auVar107);
  auVar6 = vfmadd231ps_fma(auVar104,auVar113,auVar110);
  auVar7 = vfmadd231ps_fma(auVar108,auVar113,auVar117);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar210,auVar109);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar210,auVar119);
  auVar201._8_4_ = 0x7fffffff;
  auVar201._0_8_ = 0x7fffffff7fffffff;
  auVar201._12_4_ = 0x7fffffff;
  auVar201._16_4_ = 0x7fffffff;
  auVar201._20_4_ = 0x7fffffff;
  auVar201._24_4_ = 0x7fffffff;
  auVar201._28_4_ = 0x7fffffff;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar210,auVar118);
  auVar109 = vandps_avx(ZEXT1632(auVar98),auVar201);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar198._16_4_ = 0x219392ef;
  auVar198._20_4_ = 0x219392ef;
  auVar198._24_4_ = 0x219392ef;
  auVar198._28_4_ = 0x219392ef;
  uVar92 = vcmpps_avx512vl(auVar109,auVar198,1);
  bVar14 = (bool)((byte)uVar92 & 1);
  auVar105._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar98._0_4_;
  bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar98._4_4_;
  bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar98._8_4_;
  bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar98._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar92 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar96),auVar201);
  uVar92 = vcmpps_avx512vl(auVar109,auVar198,1);
  bVar14 = (bool)((byte)uVar92 & 1);
  auVar115._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar96._0_4_;
  bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar96._4_4_;
  bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar96._8_4_;
  bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar96._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar92 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar103),auVar201);
  uVar92 = vcmpps_avx512vl(auVar109,auVar198,1);
  bVar14 = (bool)((byte)uVar92 & 1);
  auVar109._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._0_4_;
  bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._4_4_;
  bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._8_4_;
  bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar92 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar92 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar92 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar92 >> 7) * 0x219392ef;
  auVar107 = vrcp14ps_avx512vl(auVar105);
  auVar199._8_4_ = 0x3f800000;
  auVar199._0_8_ = &DAT_3f8000003f800000;
  auVar199._12_4_ = 0x3f800000;
  auVar199._16_4_ = 0x3f800000;
  auVar199._20_4_ = 0x3f800000;
  auVar199._24_4_ = 0x3f800000;
  auVar199._28_4_ = 0x3f800000;
  auVar98 = vfnmadd213ps_fma(auVar105,auVar107,auVar199);
  auVar98 = vfmadd132ps_fma(ZEXT1632(auVar98),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar115);
  auVar96 = vfnmadd213ps_fma(auVar115,auVar107,auVar199);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar109);
  auVar103 = vfnmadd213ps_fma(auVar109,auVar107,auVar199);
  auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar107,auVar107);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 7 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar102));
  auVar118._4_4_ = auVar98._4_4_ * auVar109._4_4_;
  auVar118._0_4_ = auVar98._0_4_ * auVar109._0_4_;
  auVar118._8_4_ = auVar98._8_4_ * auVar109._8_4_;
  auVar118._12_4_ = auVar98._12_4_ * auVar109._12_4_;
  auVar118._16_4_ = auVar109._16_4_ * 0.0;
  auVar118._20_4_ = auVar109._20_4_ * 0.0;
  auVar118._24_4_ = auVar109._24_4_ * 0.0;
  auVar118._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 9 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar102));
  auVar108 = vpbroadcastd_avx512vl();
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar174._0_4_ = auVar98._0_4_ * auVar109._0_4_;
  auVar174._4_4_ = auVar98._4_4_ * auVar109._4_4_;
  auVar174._8_4_ = auVar98._8_4_ * auVar109._8_4_;
  auVar174._12_4_ = auVar98._12_4_ * auVar109._12_4_;
  auVar174._16_4_ = auVar109._16_4_ * 0.0;
  auVar174._20_4_ = auVar109._20_4_ * 0.0;
  auVar174._24_4_ = auVar109._24_4_ * 0.0;
  auVar174._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar10 * 0x10 + uVar89 * -2 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar6));
  auVar117._4_4_ = auVar96._4_4_ * auVar109._4_4_;
  auVar117._0_4_ = auVar96._0_4_ * auVar109._0_4_;
  auVar117._8_4_ = auVar96._8_4_ * auVar109._8_4_;
  auVar117._12_4_ = auVar96._12_4_ * auVar109._12_4_;
  auVar117._16_4_ = auVar109._16_4_ * 0.0;
  auVar117._20_4_ = auVar109._20_4_ * 0.0;
  auVar117._24_4_ = auVar109._24_4_ * 0.0;
  auVar117._28_4_ = auVar109._28_4_;
  auVar200 = ZEXT3264(auVar117);
  auVar109 = vcvtdq2ps_avx(auVar107);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar6));
  auVar162._0_4_ = auVar96._0_4_ * auVar109._0_4_;
  auVar162._4_4_ = auVar96._4_4_ * auVar109._4_4_;
  auVar162._8_4_ = auVar96._8_4_ * auVar109._8_4_;
  auVar162._12_4_ = auVar96._12_4_ * auVar109._12_4_;
  auVar162._16_4_ = auVar109._16_4_ * 0.0;
  auVar162._20_4_ = auVar109._20_4_ * 0.0;
  auVar162._24_4_ = auVar109._24_4_ * 0.0;
  auVar162._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + uVar89 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar7));
  auVar112._4_4_ = auVar109._4_4_ * auVar103._4_4_;
  auVar112._0_4_ = auVar109._0_4_ * auVar103._0_4_;
  auVar112._8_4_ = auVar109._8_4_ * auVar103._8_4_;
  auVar112._12_4_ = auVar109._12_4_ * auVar103._12_4_;
  auVar112._16_4_ = auVar109._16_4_ * 0.0;
  auVar112._20_4_ = auVar109._20_4_ * 0.0;
  auVar112._24_4_ = auVar109._24_4_ * 0.0;
  auVar112._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x17 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar7));
  auVar116._0_4_ = auVar103._0_4_ * auVar109._0_4_;
  auVar116._4_4_ = auVar103._4_4_ * auVar109._4_4_;
  auVar116._8_4_ = auVar103._8_4_ * auVar109._8_4_;
  auVar116._12_4_ = auVar103._12_4_ * auVar109._12_4_;
  auVar116._16_4_ = auVar109._16_4_ * 0.0;
  auVar116._20_4_ = auVar109._20_4_ * 0.0;
  auVar116._24_4_ = auVar109._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar109 = vpminsd_avx2(auVar118,auVar174);
  auVar107 = vpminsd_avx2(auVar117,auVar162);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107 = vpminsd_avx2(auVar112,auVar116);
  uVar153 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar120._4_4_ = uVar153;
  auVar120._0_4_ = uVar153;
  auVar120._8_4_ = uVar153;
  auVar120._12_4_ = uVar153;
  auVar120._16_4_ = uVar153;
  auVar120._20_4_ = uVar153;
  auVar120._24_4_ = uVar153;
  auVar120._28_4_ = uVar153;
  auVar107 = vmaxps_avx512vl(auVar107,auVar120);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107._8_4_ = 0x3f7ffffa;
  auVar107._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar107._12_4_ = 0x3f7ffffa;
  auVar107._16_4_ = 0x3f7ffffa;
  auVar107._20_4_ = 0x3f7ffffa;
  auVar107._24_4_ = 0x3f7ffffa;
  auVar107._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar109,auVar107);
  auVar179 = ZEXT3264(local_80);
  auVar109 = vpmaxsd_avx2(auVar118,auVar174);
  auVar107 = vpmaxsd_avx2(auVar117,auVar162);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar107 = vpmaxsd_avx2(auVar112,auVar116);
  fVar176 = (ray->super_RayK<1>).tfar;
  auVar119._4_4_ = fVar176;
  auVar119._0_4_ = fVar176;
  auVar119._8_4_ = fVar176;
  auVar119._12_4_ = fVar176;
  auVar119._16_4_ = fVar176;
  auVar119._20_4_ = fVar176;
  auVar119._24_4_ = fVar176;
  auVar119._28_4_ = fVar176;
  auVar107 = vminps_avx512vl(auVar107,auVar119);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar110._8_4_ = 0x3f800003;
  auVar110._0_8_ = 0x3f8000033f800003;
  auVar110._12_4_ = 0x3f800003;
  auVar110._16_4_ = 0x3f800003;
  auVar110._20_4_ = 0x3f800003;
  auVar110._24_4_ = 0x3f800003;
  auVar110._28_4_ = 0x3f800003;
  auVar109 = vmulps_avx512vl(auVar109,auVar110);
  uVar21 = vpcmpgtd_avx512vl(auVar108,_DAT_0205a920);
  uVar154 = vcmpps_avx512vl(local_80,auVar109,2);
  if ((byte)((byte)uVar154 & (byte)uVar21) != 0) {
    uVar92 = (ulong)(byte)((byte)uVar154 & (byte)uVar21);
    pPVar90 = prim;
    do {
      local_5a0 = auVar200._0_32_;
      local_600 = auVar179._0_32_;
      local_480 = in_ZMM21._0_32_;
      local_460 = in_ZMM20._0_32_;
      lVar22 = 0;
      for (uVar82 = uVar92; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar92 = uVar92 - 1 & uVar92;
      uVar91 = *(uint *)(pPVar90 + lVar22 * 4 + 6);
      uVar82 = (ulong)(uint)((int)lVar22 << 6);
      uVar85 = *(uint *)(pPVar90 + 2);
      local_628 = (ulong)uVar85;
      pGVar12 = (context->scene->geometries).items[uVar85].ptr;
      local_620 = *(undefined1 (*) [16])(prim + uVar82 + lVar74 + 0x16);
      if (uVar92 != 0) {
        uVar87 = uVar92 - 1 & uVar92;
        for (uVar89 = uVar92; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        }
        if (uVar87 != 0) {
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_4d0 = *(undefined1 (*) [16])(prim + uVar82 + lVar74 + 0x26);
      local_4e0 = *(undefined1 (*) [16])(prim + uVar82 + lVar74 + 0x36);
      _local_4f0 = *(undefined1 (*) [16])(prim + uVar82 + lVar74 + 0x46);
      iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->super_RayK<1>).org.field_0;
      auVar96 = vsubps_avx512vl(local_620,(undefined1  [16])aVar3);
      uVar153 = auVar96._0_4_;
      auVar164._4_4_ = uVar153;
      auVar164._0_4_ = uVar153;
      auVar164._8_4_ = uVar153;
      auVar164._12_4_ = uVar153;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar176 = (pre->ray_space).vz.field_0.m128[0];
      fVar152 = (pre->ray_space).vz.field_0.m128[1];
      fVar193 = (pre->ray_space).vz.field_0.m128[2];
      fVar194 = (pre->ray_space).vz.field_0.m128[3];
      auVar204._0_4_ = auVar96._0_4_ * fVar176;
      auVar204._4_4_ = auVar96._4_4_ * fVar152;
      auVar204._8_4_ = auVar96._8_4_ * fVar193;
      auVar204._12_4_ = auVar96._12_4_ * fVar194;
      auVar98 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar5,auVar98);
      auVar103 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar164);
      auVar97 = vshufps_avx512vl(local_620,local_620,0xff);
      auVar96 = vsubps_avx(local_4d0,(undefined1  [16])aVar3);
      uVar153 = auVar96._0_4_;
      auVar99._4_4_ = uVar153;
      auVar99._0_4_ = uVar153;
      auVar99._8_4_ = uVar153;
      auVar99._12_4_ = uVar153;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar205._0_4_ = auVar96._0_4_ * fVar176;
      auVar205._4_4_ = auVar96._4_4_ * fVar152;
      auVar205._8_4_ = auVar96._8_4_ * fVar193;
      auVar205._12_4_ = auVar96._12_4_ * fVar194;
      auVar98 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar98);
      auVar102 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar99);
      auVar96 = vsubps_avx512vl(local_4e0,(undefined1  [16])aVar3);
      uVar153 = auVar96._0_4_;
      auVar100._4_4_ = uVar153;
      auVar100._0_4_ = uVar153;
      auVar100._8_4_ = uVar153;
      auVar100._12_4_ = uVar153;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar207._0_4_ = auVar96._0_4_ * fVar176;
      auVar207._4_4_ = auVar96._4_4_ * fVar152;
      auVar207._8_4_ = auVar96._8_4_ * fVar193;
      auVar207._12_4_ = auVar96._12_4_ * fVar194;
      auVar98 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar98);
      auVar6 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar100);
      auVar96 = vsubps_avx512vl(_local_4f0,(undefined1  [16])aVar3);
      uVar153 = auVar96._0_4_;
      auVar165._4_4_ = uVar153;
      auVar165._0_4_ = uVar153;
      auVar165._8_4_ = uVar153;
      auVar165._12_4_ = uVar153;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar101._0_4_ = auVar96._0_4_ * fVar176;
      auVar101._4_4_ = auVar96._4_4_ * fVar152;
      auVar101._8_4_ = auVar96._8_4_ * fVar193;
      auVar101._12_4_ = auVar96._12_4_ * fVar194;
      auVar98 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar5,auVar98);
      auVar7 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar165);
      lVar22 = (long)iVar11 * 0x44;
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      uVar153 = auVar103._0_4_;
      local_420._4_4_ = uVar153;
      local_420._0_4_ = uVar153;
      local_420._8_4_ = uVar153;
      local_420._12_4_ = uVar153;
      local_420._16_4_ = uVar153;
      local_420._20_4_ = uVar153;
      local_420._24_4_ = uVar153;
      local_420._28_4_ = uVar153;
      auVar163._8_4_ = 1;
      auVar163._0_8_ = 0x100000001;
      auVar163._12_4_ = 1;
      auVar163._16_4_ = 1;
      auVar163._20_4_ = 1;
      auVar163._24_4_ = 1;
      auVar163._28_4_ = 1;
      local_520 = vpermps_avx512vl(auVar163,ZEXT1632(auVar103));
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      local_540 = vbroadcastss_avx512vl(auVar102);
      local_220 = vpermps_avx2(auVar163,ZEXT1632(auVar102));
      auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar6);
      local_c0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar6));
      auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0xd8c);
      local_4a0 = vbroadcastss_avx512vl(auVar7);
      auVar219 = ZEXT3264(local_4a0);
      local_4c0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar7));
      auVar220 = ZEXT3264(local_4c0);
      auVar110 = vmulps_avx512vl(local_4a0,auVar119);
      auVar108 = vmulps_avx512vl(local_4c0,auVar119);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar120,local_a0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,local_c0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,local_540);
      auVar98 = vfmadd231ps_fma(auVar108,auVar107,local_220);
      auVar106 = vfmadd231ps_avx512vl(auVar110,auVar109,local_420);
      auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar109,local_520);
      auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0xd8c);
      auVar112 = vmulps_avx512vl(local_4a0,auVar117);
      auVar113 = vmulps_avx512vl(local_4c0,auVar117);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_a0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_c0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_540);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_220);
      auVar8 = vfmadd231ps_fma(auVar112,auVar110,local_420);
      auVar114 = vfmadd231ps_avx512vl(auVar113,auVar110,local_520);
      local_3e0 = vsubps_avx512vl(ZEXT1632(auVar8),auVar106);
      local_3c0 = vsubps_avx(auVar114,auVar111);
      auVar112 = vmulps_avx512vl(auVar111,local_3e0);
      auVar113 = vmulps_avx512vl(auVar106,local_3c0);
      auVar104 = vsubps_avx512vl(auVar112,auVar113);
      auVar98 = vshufps_avx(local_4d0,local_4d0,0xff);
      uVar154 = auVar97._0_8_;
      local_e0._8_8_ = uVar154;
      local_e0._0_8_ = uVar154;
      local_e0._16_8_ = uVar154;
      local_e0._24_8_ = uVar154;
      local_100 = vbroadcastsd_avx512vl(auVar98);
      auVar98 = vshufps_avx512vl(local_4e0,local_4e0,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar98);
      auVar98 = vshufps_avx512vl(_local_4f0,_local_4f0,0xff);
      uVar154 = auVar98._0_8_;
      register0x00001248 = uVar154;
      local_140 = uVar154;
      register0x00001250 = uVar154;
      register0x00001258 = uVar154;
      auVar112 = vmulps_avx512vl(_local_140,auVar119);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar120,local_120);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,local_100);
      auVar105 = vfmadd231ps_avx512vl(auVar112,auVar109,local_e0);
      auVar112 = vmulps_avx512vl(_local_140,auVar117);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_120);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_100);
      auVar97 = vfmadd231ps_fma(auVar112,auVar110,local_e0);
      auVar113 = local_3c0;
      auVar115 = vmulps_avx512vl(local_3c0,local_3c0);
      auVar112 = local_3e0;
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_3e0,local_3e0);
      auVar116 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar97));
      auVar116 = vmulps_avx512vl(auVar116,auVar116);
      auVar115 = vmulps_avx512vl(auVar116,auVar115);
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      uVar154 = vcmpps_avx512vl(auVar104,auVar115,2);
      auVar98 = vblendps_avx(auVar103,local_620,8);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar96 = vandps_avx512vl(auVar98,auVar99);
      auVar165 = local_4d0;
      auVar98 = vblendps_avx(auVar102,local_4d0,8);
      auVar98 = vandps_avx512vl(auVar98,auVar99);
      auVar96 = vmaxps_avx(auVar96,auVar98);
      auVar164 = local_4e0;
      auVar98 = vblendps_avx(auVar6,local_4e0,8);
      auVar100 = vandps_avx512vl(auVar98,auVar99);
      auVar9 = _local_4f0;
      auVar98 = vblendps_avx(auVar7,_local_4f0,8);
      auVar98 = vandps_avx512vl(auVar98,auVar99);
      auVar98 = vmaxps_avx(auVar100,auVar98);
      auVar98 = vmaxps_avx(auVar96,auVar98);
      auVar96 = vmovshdup_avx(auVar98);
      auVar96 = vmaxss_avx(auVar96,auVar98);
      auVar98 = vshufpd_avx(auVar98,auVar98,1);
      auVar98 = vmaxss_avx(auVar98,auVar96);
      _local_3a0 = vcvtsi2ss_avx512f(_local_4f0,iVar11);
      auVar208._0_4_ = local_3a0._0_4_;
      auVar208._4_4_ = auVar208._0_4_;
      auVar208._8_4_ = auVar208._0_4_;
      auVar208._12_4_ = auVar208._0_4_;
      auVar208._16_4_ = auVar208._0_4_;
      auVar208._20_4_ = auVar208._0_4_;
      auVar208._24_4_ = auVar208._0_4_;
      auVar208._28_4_ = auVar208._0_4_;
      uVar21 = vcmpps_avx512vl(auVar208,_DAT_02020f40,0xe);
      bVar93 = (byte)uVar154 & (byte)uVar21;
      auVar98 = vmulss_avx512f(auVar98,ZEXT416(0x35000000));
      auVar177._8_4_ = 2;
      auVar177._0_8_ = 0x200000002;
      auVar177._12_4_ = 2;
      auVar177._16_4_ = 2;
      auVar177._20_4_ = 2;
      auVar177._24_4_ = 2;
      auVar177._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar177,ZEXT1632(auVar103));
      local_180 = vpermps_avx512vl(auVar177,ZEXT1632(auVar102));
      local_1a0 = vpermps_avx512vl(auVar177,ZEXT1632(auVar6));
      local_1c0 = vpermps_avx2(auVar177,ZEXT1632(auVar7));
      uVar84 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      if (bVar93 == 0) {
        auVar96 = vxorps_avx512vl(_local_4f0,_local_4f0);
        auVar217 = ZEXT1664(auVar96);
        auVar200 = ZEXT3264(local_5a0);
        in_ZMM20 = ZEXT3264(local_460);
        auVar179 = ZEXT3264(local_600);
        in_ZMM21 = ZEXT3264(local_480);
        auVar216 = ZEXT3264(local_420);
        auVar214 = ZEXT3264(local_520);
        auVar215 = ZEXT3264(local_540);
      }
      else {
        local_610 = ZEXT416(uVar84);
        local_400 = auVar98._0_4_;
        uStack_3fc = auVar98._4_4_;
        uStack_3f8 = auVar98._8_4_;
        uStack_3f4 = auVar98._12_4_;
        auVar117 = vmulps_avx512vl(local_1c0,auVar117);
        auVar118 = vfmadd213ps_avx512vl(auVar118,local_1a0,auVar117);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_180,auVar118);
        auVar108 = vfmadd213ps_avx512vl(auVar110,local_160,auVar108);
        auVar119 = vmulps_avx512vl(local_1c0,auVar119);
        auVar120 = vfmadd213ps_avx512vl(auVar120,local_1a0,auVar119);
        auVar118 = vfmadd213ps_avx512vl(auVar107,local_180,auVar120);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1f9c);
        auVar118 = vfmadd213ps_avx512vl(auVar109,local_160,auVar118);
        auVar109 = vmulps_avx512vl(local_4a0,auVar110);
        auVar117 = vmulps_avx512vl(local_4c0,auVar110);
        auVar110 = vmulps_avx512vl(local_1c0,auVar110);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar119,local_a0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,local_c0);
        auVar119 = vfmadd231ps_avx512vl(auVar110,local_1a0,auVar119);
        auVar215 = ZEXT3264(local_540);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,local_540);
        auVar96 = vfmadd231ps_fma(auVar117,auVar120,local_220);
        auVar110 = vfmadd231ps_avx512vl(auVar119,local_180,auVar120);
        auVar117 = vfmadd231ps_avx512vl(auVar109,auVar107,local_420);
        auVar214 = ZEXT3264(local_520);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar107,local_520);
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1f9c);
        auVar110 = vfmadd231ps_avx512vl(auVar110,local_160,auVar107);
        auVar107 = vmulps_avx512vl(local_4a0,auVar119);
        auVar115 = vmulps_avx512vl(local_4c0,auVar119);
        auVar119 = vmulps_avx512vl(local_1c0,auVar119);
        auVar218 = ZEXT1664(auVar98);
        auVar116 = vfmadd231ps_avx512vl(auVar107,auVar120,local_a0);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar120,local_c0);
        auVar120 = vfmadd231ps_avx512vl(auVar119,local_1a0,auVar120);
        auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar119 = vfmadd231ps_avx512vl(auVar116,auVar107,local_540);
        auVar96 = vfmadd231ps_fma(auVar115,auVar107,local_220);
        auVar107 = vfmadd231ps_avx512vl(auVar120,local_180,auVar107);
        auVar120 = vfmadd231ps_avx512vl(auVar119,auVar109,local_420);
        auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar109,local_520);
        auVar115 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
        auVar212._8_4_ = 0x7fffffff;
        auVar212._0_8_ = 0x7fffffff7fffffff;
        auVar212._12_4_ = 0x7fffffff;
        auVar212._16_4_ = 0x7fffffff;
        auVar212._20_4_ = 0x7fffffff;
        auVar212._24_4_ = 0x7fffffff;
        auVar212._28_4_ = 0x7fffffff;
        auVar109 = vandps_avx(auVar117,auVar212);
        auVar107 = vandps_avx(auVar104,auVar212);
        auVar107 = vmaxps_avx(auVar109,auVar107);
        auVar109 = vandps_avx(auVar110,auVar212);
        auVar109 = vmaxps_avx(auVar107,auVar109);
        auVar110 = vbroadcastss_avx512vl(auVar98);
        uVar82 = vcmpps_avx512vl(auVar109,auVar110,1);
        bVar14 = (bool)((byte)uVar82 & 1);
        auVar121._0_4_ = (float)((uint)bVar14 * local_3e0._0_4_ | (uint)!bVar14 * auVar117._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar14 * local_3e0._4_4_ | (uint)!bVar14 * auVar117._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar14 * local_3e0._8_4_ | (uint)!bVar14 * auVar117._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar14 * local_3e0._12_4_ | (uint)!bVar14 * auVar117._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar14 * local_3e0._16_4_ | (uint)!bVar14 * auVar117._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar14 * local_3e0._20_4_ | (uint)!bVar14 * auVar117._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar14 * local_3e0._24_4_ | (uint)!bVar14 * auVar117._24_4_)
        ;
        bVar14 = SUB81(uVar82 >> 7,0);
        auVar121._28_4_ = (uint)bVar14 * local_3e0._28_4_ | (uint)!bVar14 * auVar117._28_4_;
        bVar14 = (bool)((byte)uVar82 & 1);
        auVar122._0_4_ = (float)((uint)bVar14 * local_3c0._0_4_ | (uint)!bVar14 * auVar104._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar14 * local_3c0._4_4_ | (uint)!bVar14 * auVar104._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar14 * local_3c0._8_4_ | (uint)!bVar14 * auVar104._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar14 * local_3c0._12_4_ | (uint)!bVar14 * auVar104._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar14 * local_3c0._16_4_ | (uint)!bVar14 * auVar104._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar14 * local_3c0._20_4_ | (uint)!bVar14 * auVar104._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar14 * local_3c0._24_4_ | (uint)!bVar14 * auVar104._24_4_)
        ;
        bVar14 = SUB81(uVar82 >> 7,0);
        auVar122._28_4_ = (uint)bVar14 * local_3c0._28_4_ | (uint)!bVar14 * auVar104._28_4_;
        auVar109 = vandps_avx(auVar212,auVar120);
        auVar107 = vandps_avx(auVar119,auVar212);
        auVar107 = vmaxps_avx(auVar109,auVar107);
        auVar109 = vandps_avx(auVar115,auVar212);
        auVar109 = vmaxps_avx(auVar107,auVar109);
        uVar82 = vcmpps_avx512vl(auVar109,auVar110,1);
        bVar14 = (bool)((byte)uVar82 & 1);
        auVar123._0_4_ = (float)((uint)bVar14 * local_3e0._0_4_ | (uint)!bVar14 * auVar120._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar14 * local_3e0._4_4_ | (uint)!bVar14 * auVar120._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar14 * local_3e0._8_4_ | (uint)!bVar14 * auVar120._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar14 * local_3e0._12_4_ | (uint)!bVar14 * auVar120._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar14 * local_3e0._16_4_ | (uint)!bVar14 * auVar120._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar14 * local_3e0._20_4_ | (uint)!bVar14 * auVar120._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar14 * local_3e0._24_4_ | (uint)!bVar14 * auVar120._24_4_)
        ;
        bVar14 = SUB81(uVar82 >> 7,0);
        auVar123._28_4_ = (uint)bVar14 * local_3e0._28_4_ | (uint)!bVar14 * auVar120._28_4_;
        bVar14 = (bool)((byte)uVar82 & 1);
        auVar124._0_4_ = (float)((uint)bVar14 * local_3c0._0_4_ | (uint)!bVar14 * auVar119._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar14 * local_3c0._4_4_ | (uint)!bVar14 * auVar119._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar14 * local_3c0._8_4_ | (uint)!bVar14 * auVar119._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar14 * local_3c0._12_4_ | (uint)!bVar14 * auVar119._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar14 * local_3c0._16_4_ | (uint)!bVar14 * auVar119._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar14 * local_3c0._20_4_ | (uint)!bVar14 * auVar119._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar14 * local_3c0._24_4_ | (uint)!bVar14 * auVar119._24_4_)
        ;
        bVar14 = SUB81(uVar82 >> 7,0);
        auVar124._28_4_ = (uint)bVar14 * local_3c0._28_4_ | (uint)!bVar14 * auVar119._28_4_;
        auVar101 = vxorps_avx512vl(_local_4f0,_local_4f0);
        auVar217 = ZEXT1664(auVar101);
        auVar109 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar101));
        auVar96 = vfmadd231ps_fma(auVar109,auVar122,auVar122);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar176 = auVar109._0_4_;
        fVar152 = auVar109._4_4_;
        fVar193 = auVar109._8_4_;
        fVar194 = auVar109._12_4_;
        fVar195 = auVar109._16_4_;
        fVar180 = auVar109._20_4_;
        fVar94 = auVar109._24_4_;
        auVar38._4_4_ = fVar152 * fVar152 * fVar152 * auVar96._4_4_ * -0.5;
        auVar38._0_4_ = fVar176 * fVar176 * fVar176 * auVar96._0_4_ * -0.5;
        auVar38._8_4_ = fVar193 * fVar193 * fVar193 * auVar96._8_4_ * -0.5;
        auVar38._12_4_ = fVar194 * fVar194 * fVar194 * auVar96._12_4_ * -0.5;
        auVar38._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar38._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar38._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar38._28_4_ = 0;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar120 = vfmadd231ps_avx512vl(auVar38,auVar107,auVar109);
        auVar39._4_4_ = auVar122._4_4_ * auVar120._4_4_;
        auVar39._0_4_ = auVar122._0_4_ * auVar120._0_4_;
        auVar39._8_4_ = auVar122._8_4_ * auVar120._8_4_;
        auVar39._12_4_ = auVar122._12_4_ * auVar120._12_4_;
        auVar39._16_4_ = auVar122._16_4_ * auVar120._16_4_;
        auVar39._20_4_ = auVar122._20_4_ * auVar120._20_4_;
        auVar39._24_4_ = auVar122._24_4_ * auVar120._24_4_;
        auVar39._28_4_ = auVar109._28_4_;
        auVar40._4_4_ = auVar120._4_4_ * -auVar121._4_4_;
        auVar40._0_4_ = auVar120._0_4_ * -auVar121._0_4_;
        auVar40._8_4_ = auVar120._8_4_ * -auVar121._8_4_;
        auVar40._12_4_ = auVar120._12_4_ * -auVar121._12_4_;
        auVar40._16_4_ = auVar120._16_4_ * -auVar121._16_4_;
        auVar40._20_4_ = auVar120._20_4_ * -auVar121._20_4_;
        auVar40._24_4_ = auVar120._24_4_ * -auVar121._24_4_;
        auVar40._28_4_ = auVar121._28_4_ ^ 0x80000000;
        auVar109 = vmulps_avx512vl(auVar120,ZEXT1632(auVar101));
        auVar104 = ZEXT1632(auVar101);
        auVar119 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar104);
        auVar96 = vfmadd231ps_fma(auVar119,auVar124,auVar124);
        auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar176 = auVar119._0_4_;
        fVar152 = auVar119._4_4_;
        fVar193 = auVar119._8_4_;
        fVar194 = auVar119._12_4_;
        fVar195 = auVar119._16_4_;
        fVar180 = auVar119._20_4_;
        fVar94 = auVar119._24_4_;
        auVar41._4_4_ = fVar152 * fVar152 * fVar152 * auVar96._4_4_ * -0.5;
        auVar41._0_4_ = fVar176 * fVar176 * fVar176 * auVar96._0_4_ * -0.5;
        auVar41._8_4_ = fVar193 * fVar193 * fVar193 * auVar96._8_4_ * -0.5;
        auVar41._12_4_ = fVar194 * fVar194 * fVar194 * auVar96._12_4_ * -0.5;
        auVar41._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar41._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar41._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar41._28_4_ = 0;
        auVar107 = vfmadd231ps_avx512vl(auVar41,auVar107,auVar119);
        auVar42._4_4_ = auVar124._4_4_ * auVar107._4_4_;
        auVar42._0_4_ = auVar124._0_4_ * auVar107._0_4_;
        auVar42._8_4_ = auVar124._8_4_ * auVar107._8_4_;
        auVar42._12_4_ = auVar124._12_4_ * auVar107._12_4_;
        auVar42._16_4_ = auVar124._16_4_ * auVar107._16_4_;
        auVar42._20_4_ = auVar124._20_4_ * auVar107._20_4_;
        auVar42._24_4_ = auVar124._24_4_ * auVar107._24_4_;
        auVar42._28_4_ = auVar119._28_4_;
        auVar43._4_4_ = -auVar123._4_4_ * auVar107._4_4_;
        auVar43._0_4_ = -auVar123._0_4_ * auVar107._0_4_;
        auVar43._8_4_ = -auVar123._8_4_ * auVar107._8_4_;
        auVar43._12_4_ = -auVar123._12_4_ * auVar107._12_4_;
        auVar43._16_4_ = -auVar123._16_4_ * auVar107._16_4_;
        auVar43._20_4_ = -auVar123._20_4_ * auVar107._20_4_;
        auVar43._24_4_ = -auVar123._24_4_ * auVar107._24_4_;
        auVar43._28_4_ = auVar120._28_4_;
        auVar107 = vmulps_avx512vl(auVar107,auVar104);
        auVar96 = vfmadd213ps_fma(auVar39,auVar105,auVar106);
        auVar103 = vfmadd213ps_fma(auVar40,auVar105,auVar111);
        auVar120 = vfmadd213ps_avx512vl(auVar109,auVar105,auVar118);
        auVar119 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar97),ZEXT1632(auVar8));
        auVar99 = vfnmadd213ps_fma(auVar39,auVar105,auVar106);
        auVar117 = ZEXT1632(auVar97);
        auVar102 = vfmadd213ps_fma(auVar43,auVar117,auVar114);
        auVar100 = vfnmadd213ps_fma(auVar40,auVar105,auVar111);
        auVar6 = vfmadd213ps_fma(auVar107,auVar117,auVar108);
        auVar110 = vfnmadd231ps_avx512vl(auVar118,auVar105,auVar109);
        auVar204 = vfnmadd213ps_fma(auVar42,auVar117,ZEXT1632(auVar8));
        auVar205 = vfnmadd213ps_fma(auVar43,auVar117,auVar114);
        auVar207 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar97),auVar107);
        auVar107 = vsubps_avx512vl(auVar119,ZEXT1632(auVar99));
        auVar109 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar100));
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar6),auVar110);
        auVar118 = vmulps_avx512vl(auVar109,auVar110);
        auVar7 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar100),auVar108);
        auVar44._4_4_ = auVar99._4_4_ * auVar108._4_4_;
        auVar44._0_4_ = auVar99._0_4_ * auVar108._0_4_;
        auVar44._8_4_ = auVar99._8_4_ * auVar108._8_4_;
        auVar44._12_4_ = auVar99._12_4_ * auVar108._12_4_;
        auVar44._16_4_ = auVar108._16_4_ * 0.0;
        auVar44._20_4_ = auVar108._20_4_ * 0.0;
        auVar44._24_4_ = auVar108._24_4_ * 0.0;
        auVar44._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar44,auVar110,auVar107);
        auVar45._4_4_ = auVar100._4_4_ * auVar107._4_4_;
        auVar45._0_4_ = auVar100._0_4_ * auVar107._0_4_;
        auVar45._8_4_ = auVar100._8_4_ * auVar107._8_4_;
        auVar45._12_4_ = auVar100._12_4_ * auVar107._12_4_;
        auVar45._16_4_ = auVar107._16_4_ * 0.0;
        auVar45._20_4_ = auVar107._20_4_ * 0.0;
        auVar45._24_4_ = auVar107._24_4_ * 0.0;
        auVar45._28_4_ = auVar107._28_4_;
        auVar8 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar99),auVar109);
        auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar104,auVar108);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,ZEXT1632(auVar7));
        auVar104 = ZEXT1632(auVar101);
        uVar82 = vcmpps_avx512vl(auVar109,auVar104,2);
        bVar81 = (byte)uVar82;
        fVar94 = (float)((uint)(bVar81 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar204._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        fVar175 = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar204._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        fVar145 = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar204._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        fVar148 = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar204._12_4_);
        auVar118 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar145,CONCAT44(fVar175,fVar94))));
        fVar95 = (float)((uint)(bVar81 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar205._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        fVar144 = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar205._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        fVar146 = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar205._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        fVar149 = (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar205._12_4_);
        auVar117 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar146,CONCAT44(fVar144,fVar95))));
        auVar125._0_4_ =
             (float)((uint)(bVar81 & 1) * auVar120._0_4_ |
                    (uint)!(bool)(bVar81 & 1) * auVar207._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar207._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar207._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar207._12_4_);
        fVar176 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar120._16_4_);
        auVar125._16_4_ = fVar176;
        fVar152 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar120._20_4_);
        auVar125._20_4_ = fVar152;
        fVar193 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar120._24_4_);
        auVar125._24_4_ = fVar193;
        iVar1 = (uint)(byte)(uVar82 >> 7) * auVar120._28_4_;
        auVar125._28_4_ = iVar1;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar99),auVar119);
        auVar126._0_4_ =
             (uint)(bVar81 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar7._0_4_;
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar7._4_4_;
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar7._8_4_;
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar7._12_4_;
        auVar126._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * auVar107._16_4_;
        auVar126._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * auVar107._20_4_;
        auVar126._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * auVar107._24_4_;
        auVar126._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar102));
        auVar127._0_4_ =
             (float)((uint)(bVar81 & 1) * auVar107._0_4_ |
                    (uint)!(bool)(bVar81 & 1) * auVar103._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar103._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar103._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar103._12_4_);
        fVar194 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar107._16_4_);
        auVar127._16_4_ = fVar194;
        fVar195 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar107._20_4_);
        auVar127._20_4_ = fVar195;
        fVar180 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar107._24_4_);
        auVar127._24_4_ = fVar180;
        auVar127._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar6));
        auVar128._0_4_ =
             (float)((uint)(bVar81 & 1) * auVar107._0_4_ |
                    (uint)!(bool)(bVar81 & 1) * auVar120._0_4_);
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar120._4_4_);
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar120._8_4_);
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar120._12_4_);
        bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar120._16_4_);
        bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar120._20_4_);
        bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar120._24_4_);
        bVar14 = SUB81(uVar82 >> 7,0);
        auVar128._28_4_ = (uint)bVar14 * auVar107._28_4_ | (uint)!bVar14 * auVar120._28_4_;
        auVar129._0_4_ =
             (uint)(bVar81 & 1) * (int)auVar99._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar119._0_4_;
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar14 * (int)auVar99._4_4_ | (uint)!bVar14 * auVar119._4_4_;
        bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar14 * (int)auVar99._8_4_ | (uint)!bVar14 * auVar119._8_4_;
        bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar14 * (int)auVar99._12_4_ | (uint)!bVar14 * auVar119._12_4_;
        auVar129._16_4_ = (uint)!(bool)((byte)(uVar82 >> 4) & 1) * auVar119._16_4_;
        auVar129._20_4_ = (uint)!(bool)((byte)(uVar82 >> 5) & 1) * auVar119._20_4_;
        auVar129._24_4_ = (uint)!(bool)((byte)(uVar82 >> 6) & 1) * auVar119._24_4_;
        auVar129._28_4_ = (uint)!SUB81(uVar82 >> 7,0) * auVar119._28_4_;
        bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar82 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar130._0_4_ =
             (uint)(bVar81 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar6._0_4_;
        bVar15 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar15 * auVar110._4_4_ | (uint)!bVar15 * auVar6._4_4_;
        bVar15 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar15 * auVar110._8_4_ | (uint)!bVar15 * auVar6._8_4_;
        bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar15 * auVar110._12_4_ | (uint)!bVar15 * auVar6._12_4_;
        auVar130._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * auVar110._16_4_;
        auVar130._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * auVar110._20_4_;
        auVar130._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * auVar110._24_4_;
        iVar2 = (uint)(byte)(uVar82 >> 7) * auVar110._28_4_;
        auVar130._28_4_ = iVar2;
        auVar106 = vsubps_avx512vl(auVar129,auVar118);
        auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar100._12_4_ |
                                                 (uint)!bVar17 * auVar102._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar100._8_4_ |
                                                          (uint)!bVar16 * auVar102._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar100._4_4_ |
                                                                   (uint)!bVar14 * auVar102._4_4_,
                                                                   (uint)(bVar81 & 1) *
                                                                   (int)auVar100._0_4_ |
                                                                   (uint)!(bool)(bVar81 & 1) *
                                                                   auVar102._0_4_)))),auVar117);
        auVar120 = vsubps_avx(auVar130,auVar125);
        auVar119 = vsubps_avx(auVar118,auVar126);
        auVar110 = vsubps_avx(auVar117,auVar127);
        auVar108 = vsubps_avx(auVar125,auVar128);
        auVar46._4_4_ = auVar120._4_4_ * fVar175;
        auVar46._0_4_ = auVar120._0_4_ * fVar94;
        auVar46._8_4_ = auVar120._8_4_ * fVar145;
        auVar46._12_4_ = auVar120._12_4_ * fVar148;
        auVar46._16_4_ = auVar120._16_4_ * 0.0;
        auVar46._20_4_ = auVar120._20_4_ * 0.0;
        auVar46._24_4_ = auVar120._24_4_ * 0.0;
        auVar46._28_4_ = iVar2;
        auVar96 = vfmsub231ps_fma(auVar46,auVar125,auVar106);
        auVar47._4_4_ = fVar144 * auVar106._4_4_;
        auVar47._0_4_ = fVar95 * auVar106._0_4_;
        auVar47._8_4_ = fVar146 * auVar106._8_4_;
        auVar47._12_4_ = fVar149 * auVar106._12_4_;
        auVar47._16_4_ = auVar106._16_4_ * 0.0;
        auVar47._20_4_ = auVar106._20_4_ * 0.0;
        auVar47._24_4_ = auVar106._24_4_ * 0.0;
        auVar47._28_4_ = auVar109._28_4_;
        auVar103 = vfmsub231ps_fma(auVar47,auVar118,auVar107);
        auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar104,ZEXT1632(auVar96));
        auVar189._0_4_ = auVar107._0_4_ * auVar125._0_4_;
        auVar189._4_4_ = auVar107._4_4_ * auVar125._4_4_;
        auVar189._8_4_ = auVar107._8_4_ * auVar125._8_4_;
        auVar189._12_4_ = auVar107._12_4_ * auVar125._12_4_;
        auVar189._16_4_ = auVar107._16_4_ * fVar176;
        auVar189._20_4_ = auVar107._20_4_ * fVar152;
        auVar189._24_4_ = auVar107._24_4_ * fVar193;
        auVar189._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar189,auVar117,auVar120);
        auVar111 = vfmadd231ps_avx512vl(auVar109,auVar104,ZEXT1632(auVar96));
        auVar109 = vmulps_avx512vl(auVar108,auVar126);
        auVar109 = vfmsub231ps_avx512vl(auVar109,auVar119,auVar128);
        auVar48._4_4_ = auVar110._4_4_ * auVar128._4_4_;
        auVar48._0_4_ = auVar110._0_4_ * auVar128._0_4_;
        auVar48._8_4_ = auVar110._8_4_ * auVar128._8_4_;
        auVar48._12_4_ = auVar110._12_4_ * auVar128._12_4_;
        auVar48._16_4_ = auVar110._16_4_ * auVar128._16_4_;
        auVar48._20_4_ = auVar110._20_4_ * auVar128._20_4_;
        auVar48._24_4_ = auVar110._24_4_ * auVar128._24_4_;
        auVar48._28_4_ = auVar128._28_4_;
        auVar96 = vfmsub231ps_fma(auVar48,auVar127,auVar108);
        auVar190._0_4_ = auVar127._0_4_ * auVar119._0_4_;
        auVar190._4_4_ = auVar127._4_4_ * auVar119._4_4_;
        auVar190._8_4_ = auVar127._8_4_ * auVar119._8_4_;
        auVar190._12_4_ = auVar127._12_4_ * auVar119._12_4_;
        auVar190._16_4_ = fVar194 * auVar119._16_4_;
        auVar190._20_4_ = fVar195 * auVar119._20_4_;
        auVar190._24_4_ = fVar180 * auVar119._24_4_;
        auVar190._28_4_ = 0;
        auVar103 = vfmsub231ps_fma(auVar190,auVar110,auVar126);
        auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar104,auVar109);
        auVar114 = vfmadd231ps_avx512vl(auVar109,auVar104,ZEXT1632(auVar96));
        auVar109 = vmaxps_avx(auVar111,auVar114);
        uVar154 = vcmpps_avx512vl(auVar109,auVar104,2);
        bVar93 = bVar93 & (byte)uVar154;
        in_ZMM20 = ZEXT3264(local_460);
        in_ZMM21 = ZEXT3264(local_480);
        auVar216 = ZEXT3264(local_420);
        if (bVar93 == 0) {
          bVar93 = 0;
          auVar200 = ZEXT3264(local_5a0);
          auVar179 = ZEXT3264(local_600);
        }
        else {
          auVar49._4_4_ = auVar108._4_4_ * auVar107._4_4_;
          auVar49._0_4_ = auVar108._0_4_ * auVar107._0_4_;
          auVar49._8_4_ = auVar108._8_4_ * auVar107._8_4_;
          auVar49._12_4_ = auVar108._12_4_ * auVar107._12_4_;
          auVar49._16_4_ = auVar108._16_4_ * auVar107._16_4_;
          auVar49._20_4_ = auVar108._20_4_ * auVar107._20_4_;
          auVar49._24_4_ = auVar108._24_4_ * auVar107._24_4_;
          auVar49._28_4_ = auVar109._28_4_;
          auVar102 = vfmsub231ps_fma(auVar49,auVar110,auVar120);
          auVar50._4_4_ = auVar120._4_4_ * auVar119._4_4_;
          auVar50._0_4_ = auVar120._0_4_ * auVar119._0_4_;
          auVar50._8_4_ = auVar120._8_4_ * auVar119._8_4_;
          auVar50._12_4_ = auVar120._12_4_ * auVar119._12_4_;
          auVar50._16_4_ = auVar120._16_4_ * auVar119._16_4_;
          auVar50._20_4_ = auVar120._20_4_ * auVar119._20_4_;
          auVar50._24_4_ = auVar120._24_4_ * auVar119._24_4_;
          auVar50._28_4_ = auVar120._28_4_;
          auVar103 = vfmsub231ps_fma(auVar50,auVar106,auVar108);
          auVar51._4_4_ = auVar110._4_4_ * auVar106._4_4_;
          auVar51._0_4_ = auVar110._0_4_ * auVar106._0_4_;
          auVar51._8_4_ = auVar110._8_4_ * auVar106._8_4_;
          auVar51._12_4_ = auVar110._12_4_ * auVar106._12_4_;
          auVar51._16_4_ = auVar110._16_4_ * auVar106._16_4_;
          auVar51._20_4_ = auVar110._20_4_ * auVar106._20_4_;
          auVar51._24_4_ = auVar110._24_4_ * auVar106._24_4_;
          auVar51._28_4_ = auVar110._28_4_;
          auVar6 = vfmsub231ps_fma(auVar51,auVar119,auVar107);
          auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar6));
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar102),auVar104);
          auVar107 = vrcp14ps_avx512vl(auVar109);
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = &DAT_3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar120 = vfnmadd213ps_avx512vl(auVar107,auVar109,auVar27);
          auVar96 = vfmadd132ps_fma(auVar120,auVar107,auVar107);
          auVar52._4_4_ = auVar6._4_4_ * auVar125._4_4_;
          auVar52._0_4_ = auVar6._0_4_ * auVar125._0_4_;
          auVar52._8_4_ = auVar6._8_4_ * auVar125._8_4_;
          auVar52._12_4_ = auVar6._12_4_ * auVar125._12_4_;
          auVar52._16_4_ = fVar176 * 0.0;
          auVar52._20_4_ = fVar152 * 0.0;
          auVar52._24_4_ = fVar193 * 0.0;
          auVar52._28_4_ = iVar1;
          auVar103 = vfmadd231ps_fma(auVar52,auVar117,ZEXT1632(auVar103));
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar118,ZEXT1632(auVar102));
          fVar152 = auVar96._0_4_;
          fVar193 = auVar96._4_4_;
          fVar194 = auVar96._8_4_;
          fVar195 = auVar96._12_4_;
          auVar107 = ZEXT1632(CONCAT412(auVar103._12_4_ * fVar195,
                                        CONCAT48(auVar103._8_4_ * fVar194,
                                                 CONCAT44(auVar103._4_4_ * fVar193,
                                                          auVar103._0_4_ * fVar152))));
          auVar202._4_4_ = uVar84;
          auVar202._0_4_ = uVar84;
          auVar202._8_4_ = uVar84;
          auVar202._12_4_ = uVar84;
          auVar202._16_4_ = uVar84;
          auVar202._20_4_ = uVar84;
          auVar202._24_4_ = uVar84;
          auVar202._28_4_ = uVar84;
          uVar154 = vcmpps_avx512vl(auVar202,auVar107,2);
          fVar176 = (ray->super_RayK<1>).tfar;
          auVar28._4_4_ = fVar176;
          auVar28._0_4_ = fVar176;
          auVar28._8_4_ = fVar176;
          auVar28._12_4_ = fVar176;
          auVar28._16_4_ = fVar176;
          auVar28._20_4_ = fVar176;
          auVar28._24_4_ = fVar176;
          auVar28._28_4_ = fVar176;
          uVar21 = vcmpps_avx512vl(auVar107,auVar28,2);
          bVar93 = (byte)uVar154 & (byte)uVar21 & bVar93;
          if (bVar93 == 0) {
            bVar93 = 0;
            auVar200 = ZEXT3264(local_5a0);
            auVar179 = ZEXT3264(local_600);
          }
          else {
            uVar154 = vcmpps_avx512vl(auVar109,auVar104,4);
            if ((bVar93 & (byte)uVar154) == 0) {
              bVar93 = 0;
              auVar200 = ZEXT3264(local_5a0);
              auVar179 = ZEXT3264(local_600);
            }
            else {
              bVar93 = bVar93 & (byte)uVar154;
              fVar176 = auVar111._0_4_ * fVar152;
              fVar180 = auVar111._4_4_ * fVar193;
              auVar53._4_4_ = fVar180;
              auVar53._0_4_ = fVar176;
              fVar94 = auVar111._8_4_ * fVar194;
              auVar53._8_4_ = fVar94;
              fVar95 = auVar111._12_4_ * fVar195;
              auVar53._12_4_ = fVar95;
              fVar175 = auVar111._16_4_ * 0.0;
              auVar53._16_4_ = fVar175;
              fVar144 = auVar111._20_4_ * 0.0;
              auVar53._20_4_ = fVar144;
              fVar145 = auVar111._24_4_ * 0.0;
              auVar53._24_4_ = fVar145;
              auVar53._28_4_ = auVar111._28_4_;
              fVar152 = auVar114._0_4_ * fVar152;
              fVar193 = auVar114._4_4_ * fVar193;
              auVar54._4_4_ = fVar193;
              auVar54._0_4_ = fVar152;
              fVar194 = auVar114._8_4_ * fVar194;
              auVar54._8_4_ = fVar194;
              fVar195 = auVar114._12_4_ * fVar195;
              auVar54._12_4_ = fVar195;
              fVar146 = auVar114._16_4_ * 0.0;
              auVar54._16_4_ = fVar146;
              fVar148 = auVar114._20_4_ * 0.0;
              auVar54._20_4_ = fVar148;
              fVar149 = auVar114._24_4_ * 0.0;
              auVar54._24_4_ = fVar149;
              auVar54._28_4_ = auVar114._28_4_;
              auVar196._8_4_ = 0x3f800000;
              auVar196._0_8_ = &DAT_3f8000003f800000;
              auVar196._12_4_ = 0x3f800000;
              auVar196._16_4_ = 0x3f800000;
              auVar196._20_4_ = 0x3f800000;
              auVar196._24_4_ = 0x3f800000;
              auVar196._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar196,auVar53);
              bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar82 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar82 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar82 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar82 >> 6) & 1);
              bVar20 = SUB81(uVar82 >> 7,0);
              auVar200 = ZEXT3264(CONCAT428((uint)bVar20 * auVar111._28_4_ |
                                            (uint)!bVar20 * auVar109._28_4_,
                                            CONCAT424((uint)bVar19 * (int)fVar145 |
                                                      (uint)!bVar19 * auVar109._24_4_,
                                                      CONCAT420((uint)bVar18 * (int)fVar144 |
                                                                (uint)!bVar18 * auVar109._20_4_,
                                                                CONCAT416((uint)bVar17 *
                                                                          (int)fVar175 |
                                                                          (uint)!bVar17 *
                                                                          auVar109._16_4_,
                                                                          CONCAT412((uint)bVar16 *
                                                                                    (int)fVar95 |
                                                                                    (uint)!bVar16 *
                                                                                    auVar109._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar15 * (int)fVar94 |
                                                  (uint)!bVar15 * auVar109._8_4_,
                                                  CONCAT44((uint)bVar14 * (int)fVar180 |
                                                           (uint)!bVar14 * auVar109._4_4_,
                                                           (uint)(bVar81 & 1) * (int)fVar176 |
                                                           (uint)!(bool)(bVar81 & 1) *
                                                           auVar109._0_4_))))))));
              auVar109 = vsubps_avx(auVar196,auVar54);
              bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar82 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar82 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar82 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar82 >> 6) & 1);
              bVar20 = SUB81(uVar82 >> 7,0);
              local_240._4_4_ = (uint)bVar14 * (int)fVar193 | (uint)!bVar14 * auVar109._4_4_;
              local_240._0_4_ =
                   (uint)(bVar81 & 1) * (int)fVar152 | (uint)!(bool)(bVar81 & 1) * auVar109._0_4_;
              local_240._8_4_ = (uint)bVar15 * (int)fVar194 | (uint)!bVar15 * auVar109._8_4_;
              local_240._12_4_ = (uint)bVar16 * (int)fVar195 | (uint)!bVar16 * auVar109._12_4_;
              local_240._16_4_ = (uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar109._16_4_;
              local_240._20_4_ = (uint)bVar18 * (int)fVar148 | (uint)!bVar18 * auVar109._20_4_;
              local_240._24_4_ = (uint)bVar19 * (int)fVar149 | (uint)!bVar19 * auVar109._24_4_;
              local_240._28_4_ = (uint)bVar20 * auVar114._28_4_ | (uint)!bVar20 * auVar109._28_4_;
              auVar179 = ZEXT3264(auVar107);
            }
          }
        }
        auVar220 = ZEXT3264(local_4c0);
        auVar219 = ZEXT3264(local_4a0);
        auVar203 = ZEXT1664(local_620);
        if (bVar93 != 0) {
          auVar109 = vsubps_avx(ZEXT1632(auVar97),auVar105);
          local_380 = auVar200._0_32_;
          auVar96 = vfmadd213ps_fma(auVar109,local_380,auVar105);
          fVar176 = pre->depth_scale;
          auVar29._4_4_ = fVar176;
          auVar29._0_4_ = fVar176;
          auVar29._8_4_ = fVar176;
          auVar29._12_4_ = fVar176;
          auVar29._16_4_ = fVar176;
          auVar29._20_4_ = fVar176;
          auVar29._24_4_ = fVar176;
          auVar29._28_4_ = fVar176;
          auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                        CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                 CONCAT44(auVar96._4_4_ +
                                                                          auVar96._4_4_,
                                                                          auVar96._0_4_ +
                                                                          auVar96._0_4_)))),auVar29)
          ;
          local_340 = auVar179._0_32_;
          uVar154 = vcmpps_avx512vl(local_340,auVar109,6);
          bVar93 = bVar93 & (byte)uVar154;
          if (bVar93 != 0) {
            auVar155._8_4_ = 0xbf800000;
            auVar155._0_8_ = 0xbf800000bf800000;
            auVar155._12_4_ = 0xbf800000;
            auVar155._16_4_ = 0xbf800000;
            auVar155._20_4_ = 0xbf800000;
            auVar155._24_4_ = 0xbf800000;
            auVar155._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_240 = vfmadd132ps_avx512vl(local_240,auVar155,auVar30);
            auVar109 = local_240;
            local_360 = local_240;
            local_320 = 0;
            local_31c = iVar11;
            local_310 = local_620;
            local_300 = local_4d0._0_8_;
            uStack_2f8 = local_4d0._8_8_;
            local_2f0 = local_4e0._0_8_;
            uStack_2e8 = local_4e0._8_8_;
            local_2e0 = local_4f0;
            uStack_2d8 = uStack_4e8;
            local_2d0 = bVar93;
            local_240 = auVar109;
            if ((pGVar12->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar176 = 1.0 / auVar208._0_4_;
              local_2c0[0] = fVar176 * (auVar200._0_4_ + 0.0);
              local_2c0[1] = fVar176 * (auVar200._4_4_ + 1.0);
              local_2c0[2] = fVar176 * (auVar200._8_4_ + 2.0);
              local_2c0[3] = fVar176 * (auVar200._12_4_ + 3.0);
              fStack_2b0 = fVar176 * (auVar200._16_4_ + 4.0);
              fStack_2ac = fVar176 * (auVar200._20_4_ + 5.0);
              fStack_2a8 = fVar176 * (auVar200._24_4_ + 6.0);
              fStack_2a4 = auVar200._28_4_ + 7.0;
              local_2a0 = local_240._0_8_;
              uStack_298 = local_240._8_8_;
              uStack_290 = local_240._16_8_;
              uStack_288 = local_240._24_8_;
              local_280 = local_340;
              auVar156._8_4_ = 0x7f800000;
              auVar156._0_8_ = 0x7f8000007f800000;
              auVar156._12_4_ = 0x7f800000;
              auVar156._16_4_ = 0x7f800000;
              auVar156._20_4_ = 0x7f800000;
              auVar156._24_4_ = 0x7f800000;
              auVar156._28_4_ = 0x7f800000;
              auVar107 = vblendmps_avx512vl(auVar156,local_340);
              auVar131._0_4_ =
                   (uint)(bVar93 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
              bVar14 = (bool)(bVar93 >> 1 & 1);
              auVar131._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar93 >> 2 & 1);
              auVar131._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar93 >> 3 & 1);
              auVar131._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar93 >> 4 & 1);
              auVar131._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar93 >> 5 & 1);
              auVar131._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar93 >> 6 & 1);
              auVar131._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * 0x7f800000;
              auVar131._28_4_ =
                   (uint)(bVar93 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
              auVar107 = vshufps_avx(auVar131,auVar131,0xb1);
              auVar107 = vminps_avx(auVar131,auVar107);
              auVar120 = vshufpd_avx(auVar107,auVar107,5);
              auVar107 = vminps_avx(auVar107,auVar120);
              auVar120 = vpermpd_avx2(auVar107,0x4e);
              auVar107 = vminps_avx(auVar107,auVar120);
              uVar154 = vcmpps_avx512vl(auVar131,auVar107,0);
              bVar80 = (byte)uVar154 & bVar93;
              bVar81 = bVar93;
              if (bVar80 != 0) {
                bVar81 = bVar80;
              }
              uVar86 = 0;
              for (uVar83 = (uint)bVar81; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                uVar86 = uVar86 + 1;
              }
              uVar82 = (ulong)uVar86;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar176 = local_2c0[uVar82];
                fVar152 = *(float *)((long)&local_2a0 + uVar82 * 4);
                fVar193 = 1.0 - fVar176;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar102 = vxorps_avx512vl(ZEXT416((uint)fVar193),auVar23);
                auVar96 = ZEXT416((uint)(fVar176 * fVar193 * 4.0));
                auVar103 = vfnmsub213ss_fma(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),auVar96);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),auVar96);
                fVar193 = fVar193 * auVar102._0_4_ * 0.5;
                fVar194 = auVar103._0_4_ * 0.5;
                fVar195 = auVar96._0_4_ * 0.5;
                fVar180 = fVar176 * fVar176 * 0.5;
                auVar181._0_4_ = fVar180 * (float)local_4f0._0_4_;
                auVar181._4_4_ = fVar180 * (float)local_4f0._4_4_;
                auVar181._8_4_ = fVar180 * (float)uStack_4e8;
                auVar181._12_4_ = fVar180 * uStack_4e8._4_4_;
                auVar166._4_4_ = fVar195;
                auVar166._0_4_ = fVar195;
                auVar166._8_4_ = fVar195;
                auVar166._12_4_ = fVar195;
                auVar96 = vfmadd132ps_fma(auVar166,auVar181,local_4e0);
                auVar182._4_4_ = fVar194;
                auVar182._0_4_ = fVar194;
                auVar182._8_4_ = fVar194;
                auVar182._12_4_ = fVar194;
                auVar200 = ZEXT3264(local_380);
                auVar96 = vfmadd132ps_fma(auVar182,auVar96,local_4d0);
                auVar167._4_4_ = fVar193;
                auVar167._0_4_ = fVar193;
                auVar167._8_4_ = fVar193;
                auVar167._12_4_ = fVar193;
                (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar82 * 4);
                auVar179 = ZEXT3264(local_340);
                auVar96 = vfmadd213ps_fma(auVar167,local_620,auVar96);
                uVar154 = vmovlps_avx(auVar96);
                *(undefined8 *)&(ray->Ng).field_0 = uVar154;
                fVar193 = (float)vextractps_avx(auVar96,2);
                (ray->Ng).field_0.field_0.z = fVar193;
                ray->u = fVar176;
                ray->v = fVar152;
                ray->primID = uVar91;
                ray->geomID = uVar85;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_580 = local_4d0._0_4_;
                uStack_57c = local_4d0._4_4_;
                uStack_578 = local_4d0._8_8_;
                local_430 = (RTCRayQueryContext *)local_4e0._0_8_;
                uStack_428 = local_4e0._8_8_;
                local_440 = local_4f0;
                uStack_438 = uStack_4e8;
                local_630 = pPVar90;
                local_638 = context;
                local_640 = ray;
                local_648 = pre;
                local_5a0 = local_380;
                local_600 = local_340;
                _local_4f0 = auVar9;
                local_4e0 = auVar164;
                local_4d0 = auVar165;
                local_3e0 = auVar112;
                local_3c0 = auVar113;
                do {
                  auVar102 = auVar217._0_16_;
                  local_564 = local_2c0[uVar82];
                  local_560 = *(undefined4 *)((long)&local_2a0 + uVar82 * 4);
                  local_3e0._0_4_ = (ray->super_RayK<1>).tfar;
                  local_3c0._0_8_ = uVar82;
                  (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar82 * 4);
                  local_5d0.context = context->user;
                  fVar176 = 1.0 - local_564;
                  auVar26._8_4_ = 0x80000000;
                  auVar26._0_8_ = 0x8000000080000000;
                  auVar26._12_4_ = 0x80000000;
                  auVar103 = vxorps_avx512vl(ZEXT416((uint)fVar176),auVar26);
                  auVar98 = ZEXT416((uint)(local_564 * fVar176 * 4.0));
                  auVar96 = vfnmsub213ss_fma(ZEXT416((uint)local_564),ZEXT416((uint)local_564),
                                             auVar98);
                  auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),auVar98);
                  fVar176 = fVar176 * auVar103._0_4_ * 0.5;
                  fVar152 = auVar96._0_4_ * 0.5;
                  fVar193 = auVar98._0_4_ * 0.5;
                  fVar194 = local_564 * local_564 * 0.5;
                  auVar187._0_4_ = fVar194 * (float)local_440;
                  auVar187._4_4_ = fVar194 * local_440._4_4_;
                  auVar187._8_4_ = fVar194 * (float)uStack_438;
                  auVar187._12_4_ = fVar194 * uStack_438._4_4_;
                  auVar172._4_4_ = fVar193;
                  auVar172._0_4_ = fVar193;
                  auVar172._8_4_ = fVar193;
                  auVar172._12_4_ = fVar193;
                  auVar76._8_8_ = uStack_428;
                  auVar76._0_8_ = local_430;
                  auVar98 = vfmadd132ps_fma(auVar172,auVar187,auVar76);
                  auVar188._4_4_ = fVar152;
                  auVar188._0_4_ = fVar152;
                  auVar188._8_4_ = fVar152;
                  auVar188._12_4_ = fVar152;
                  auVar75._4_4_ = uStack_57c;
                  auVar75._0_4_ = local_580;
                  auVar75._8_8_ = uStack_578;
                  auVar98 = vfmadd132ps_fma(auVar188,auVar98,auVar75);
                  auVar173._4_4_ = fVar176;
                  auVar173._0_4_ = fVar176;
                  auVar173._8_4_ = fVar176;
                  auVar173._12_4_ = fVar176;
                  auVar98 = vfmadd213ps_fma(auVar173,auVar203._0_16_,auVar98);
                  local_570 = vmovlps_avx(auVar98);
                  local_568 = vextractps_avx(auVar98,2);
                  local_55c = uVar91;
                  local_558 = (int)local_628;
                  local_554 = (local_5d0.context)->instID[0];
                  local_550 = (local_5d0.context)->instPrimID[0];
                  local_64c = -1;
                  local_5d0.valid = &local_64c;
                  local_5d0.geometryUserPtr = pGVar12->userPtr;
                  local_5d0.ray = (RTCRayN *)ray;
                  local_5d0.hit = (RTCHitN *)&local_570;
                  local_5d0.N = 1;
                  if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d4f292:
                    auVar98 = auVar217._0_16_;
                    p_Var13 = context->args->filter;
                    if (p_Var13 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var13)(&local_5d0);
                        auVar218 = ZEXT1664(CONCAT412(uStack_3f4,
                                                      CONCAT48(uStack_3f8,
                                                               CONCAT44(uStack_3fc,local_400))));
                        auVar220 = ZEXT3264(local_4c0);
                        auVar219 = ZEXT3264(local_4a0);
                        auVar215 = ZEXT3264(local_540);
                        auVar214 = ZEXT3264(local_520);
                        auVar216 = ZEXT3264(local_420);
                        auVar203 = ZEXT1664(local_620);
                        in_ZMM21 = ZEXT3264(local_480);
                        in_ZMM20 = ZEXT3264(local_460);
                        auVar98 = vxorps_avx512vl(auVar98,auVar98);
                        auVar217 = ZEXT1664(auVar98);
                        ray = local_640;
                        pre = local_648;
                        pPVar90 = local_630;
                        context = local_638;
                        uVar84 = local_610._0_4_;
                      }
                      if (*local_5d0.valid == 0) goto LAB_01d4f3a3;
                    }
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5d0.hit;
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5d0.hit + 4);
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5d0.hit + 8);
                    *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
                    *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
                    *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
                    *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
                    *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
                    *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
                  }
                  else {
                    (*pGVar12->intersectionFilterN)(&local_5d0);
                    auVar218 = ZEXT1664(CONCAT412(uStack_3f4,
                                                  CONCAT48(uStack_3f8,CONCAT44(uStack_3fc,local_400)
                                                          )));
                    auVar220 = ZEXT3264(local_4c0);
                    auVar219 = ZEXT3264(local_4a0);
                    auVar215 = ZEXT3264(local_540);
                    auVar214 = ZEXT3264(local_520);
                    auVar216 = ZEXT3264(local_420);
                    auVar203 = ZEXT1664(local_620);
                    in_ZMM21 = ZEXT3264(local_480);
                    in_ZMM20 = ZEXT3264(local_460);
                    auVar98 = vxorps_avx512vl(auVar102,auVar102);
                    auVar217 = ZEXT1664(auVar98);
                    ray = local_640;
                    pre = local_648;
                    pPVar90 = local_630;
                    context = local_638;
                    uVar84 = local_610._0_4_;
                    if (*local_5d0.valid != 0) goto LAB_01d4f292;
LAB_01d4f3a3:
                    (ray->super_RayK<1>).tfar = (float)local_3e0._0_4_;
                  }
                  auVar98 = auVar218._0_16_;
                  auVar179 = ZEXT3264(local_600);
                  bVar81 = ~(byte)(1 << (local_3c0._0_4_ & 0x1f)) & bVar93;
                  fVar176 = (ray->super_RayK<1>).tfar;
                  auVar37._4_4_ = fVar176;
                  auVar37._0_4_ = fVar176;
                  auVar37._8_4_ = fVar176;
                  auVar37._12_4_ = fVar176;
                  auVar37._16_4_ = fVar176;
                  auVar37._20_4_ = fVar176;
                  auVar37._24_4_ = fVar176;
                  auVar37._28_4_ = fVar176;
                  uVar154 = vcmpps_avx512vl(local_600,auVar37,2);
                  bVar93 = bVar81 & (byte)uVar154;
                  auVar200 = ZEXT3264(local_5a0);
                  uVar82 = local_3c0._0_8_;
                  if ((bVar81 & (byte)uVar154) != 0) {
                    auVar161._8_4_ = 0x7f800000;
                    auVar161._0_8_ = 0x7f8000007f800000;
                    auVar161._12_4_ = 0x7f800000;
                    auVar161._16_4_ = 0x7f800000;
                    auVar161._20_4_ = 0x7f800000;
                    auVar161._24_4_ = 0x7f800000;
                    auVar161._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar161,local_600);
                    auVar143._0_4_ =
                         (uint)(bVar93 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                    bVar14 = (bool)(bVar93 >> 1 & 1);
                    auVar143._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar93 >> 2 & 1);
                    auVar143._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar93 >> 3 & 1);
                    auVar143._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar93 >> 4 & 1);
                    auVar143._16_4_ = (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar93 >> 5 & 1);
                    auVar143._20_4_ = (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar93 >> 6 & 1);
                    auVar143._24_4_ = (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar143._28_4_ =
                         (uint)(bVar93 >> 7) * auVar109._28_4_ |
                         (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                    auVar109 = vshufps_avx(auVar143,auVar143,0xb1);
                    auVar109 = vminps_avx(auVar143,auVar109);
                    auVar107 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    auVar107 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    uVar154 = vcmpps_avx512vl(auVar143,auVar109,0);
                    bVar80 = (byte)uVar154 & bVar93;
                    bVar81 = bVar93;
                    if (bVar80 != 0) {
                      bVar81 = bVar80;
                    }
                    uVar85 = 0;
                    for (uVar86 = (uint)bVar81; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000
                        ) {
                      uVar85 = uVar85 + 1;
                    }
                    uVar82 = (ulong)uVar85;
                  }
                  auVar9 = _local_4f0;
                  auVar164 = local_4e0;
                  auVar165 = local_4d0;
                } while (bVar93 != 0);
              }
            }
          }
        }
      }
      local_4d0 = auVar165;
      local_4e0 = auVar164;
      _local_4f0 = auVar9;
      if (8 < iVar11) {
        local_3c0 = vpbroadcastd_avx512vl();
        local_3e0 = vbroadcastss_avx512vl(auVar98);
        local_400 = uVar84;
        uStack_3fc = uVar84;
        uStack_3f8 = uVar84;
        uStack_3f4 = uVar84;
        uStack_3f0 = uVar84;
        uStack_3ec = uVar84;
        uStack_3e8 = uVar84;
        uStack_3e4 = uVar84;
        local_3a0._4_4_ = 1.0 / (float)local_3a0._0_4_;
        local_3a0._0_4_ = local_3a0._4_4_;
        fStack_398 = (float)local_3a0._4_4_;
        fStack_394 = (float)local_3a0._4_4_;
        fStack_390 = (float)local_3a0._4_4_;
        fStack_38c = (float)local_3a0._4_4_;
        fStack_388 = (float)local_3a0._4_4_;
        fStack_384 = (float)local_3a0._4_4_;
        lVar88 = 8;
        local_5a0 = auVar200._0_32_;
        local_600 = auVar179._0_32_;
        do {
          auVar109 = vpbroadcastd_avx512vl();
          auVar110 = vpor_avx2(auVar109,_DAT_0205a920);
          uVar21 = vpcmpd_avx512vl(auVar110,local_3c0,1);
          auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar88 * 4 + lVar22);
          auVar107 = *(undefined1 (*) [32])(lVar22 + 0x222bfac + lVar88 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar22 + 0x222c430 + lVar88 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar22 + 0x222c8b4 + lVar88 * 4);
          local_4a0 = auVar219._0_32_;
          auVar108 = vmulps_avx512vl(local_4a0,auVar119);
          local_4c0 = auVar220._0_32_;
          auVar118 = vmulps_avx512vl(local_4c0,auVar119);
          auVar55._4_4_ = auVar119._4_4_ * (float)local_140._4_4_;
          auVar55._0_4_ = auVar119._0_4_ * (float)local_140._0_4_;
          auVar55._8_4_ = auVar119._8_4_ * fStack_138;
          auVar55._12_4_ = auVar119._12_4_ * fStack_134;
          auVar55._16_4_ = auVar119._16_4_ * fStack_130;
          auVar55._20_4_ = auVar119._20_4_ * fStack_12c;
          auVar55._24_4_ = auVar119._24_4_ * fStack_128;
          auVar55._28_4_ = auVar110._28_4_;
          auVar110 = vfmadd231ps_avx512vl(auVar108,auVar120,local_a0);
          auVar108 = vfmadd231ps_avx512vl(auVar118,auVar120,local_c0);
          auVar118 = vfmadd231ps_avx512vl(auVar55,auVar120,local_120);
          auVar174 = auVar215._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar174);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,local_220);
          auVar98 = vfmadd231ps_fma(auVar118,auVar107,local_100);
          auVar198 = auVar216._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar198);
          auVar162 = auVar214._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar108,auVar109,auVar162);
          auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar88 * 4 + lVar22);
          auVar108 = *(undefined1 (*) [32])(lVar22 + 0x222e3cc + lVar88 * 4);
          auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar109,local_e0);
          auVar118 = *(undefined1 (*) [32])(lVar22 + 0x222e850 + lVar88 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar22 + 0x222ecd4 + lVar88 * 4);
          auVar112 = vmulps_avx512vl(local_4a0,auVar117);
          auVar113 = vmulps_avx512vl(local_4c0,auVar117);
          auVar56._4_4_ = auVar117._4_4_ * (float)local_140._4_4_;
          auVar56._0_4_ = auVar117._0_4_ * (float)local_140._0_4_;
          auVar56._8_4_ = auVar117._8_4_ * fStack_138;
          auVar56._12_4_ = auVar117._12_4_ * fStack_134;
          auVar56._16_4_ = auVar117._16_4_ * fStack_130;
          auVar56._20_4_ = auVar117._20_4_ * fStack_12c;
          auVar56._24_4_ = auVar117._24_4_ * fStack_128;
          auVar56._28_4_ = uStack_124;
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_a0);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_c0);
          auVar114 = vfmadd231ps_avx512vl(auVar56,auVar118,local_120);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar174);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_220);
          auVar96 = vfmadd231ps_fma(auVar114,auVar108,local_100);
          auVar114 = vfmadd231ps_avx512vl(auVar112,auVar110,auVar198);
          auVar104 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar162);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar110,local_e0);
          auVar105 = vmaxps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar96));
          auVar112 = vsubps_avx(auVar114,auVar106);
          auVar113 = vsubps_avx(auVar104,auVar111);
          auVar115 = vmulps_avx512vl(auVar111,auVar112);
          auVar116 = vmulps_avx512vl(auVar106,auVar113);
          auVar115 = vsubps_avx512vl(auVar115,auVar116);
          auVar116 = vmulps_avx512vl(auVar113,auVar113);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar112);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar116);
          auVar115 = vmulps_avx512vl(auVar115,auVar115);
          uVar154 = vcmpps_avx512vl(auVar115,auVar105,2);
          local_2d0 = (byte)uVar21 & (byte)uVar154;
          if (local_2d0 == 0) {
            auVar200 = ZEXT3264(local_5a0);
            auVar179 = ZEXT3264(local_600);
            auVar214 = ZEXT3264(auVar162);
            auVar215 = ZEXT3264(auVar174);
          }
          else {
            auVar117 = vmulps_avx512vl(local_1c0,auVar117);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_1a0,auVar117);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_180,auVar118);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_160,auVar108);
            auVar119 = vmulps_avx512vl(local_1c0,auVar119);
            auVar120 = vfmadd213ps_avx512vl(auVar120,local_1a0,auVar119);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar120);
            auVar108 = vfmadd213ps_avx512vl(auVar109,local_160,auVar107);
            auVar109 = *(undefined1 (*) [32])(lVar22 + 0x222cd38 + lVar88 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar22 + 0x222d1bc + lVar88 * 4);
            auVar120 = *(undefined1 (*) [32])(lVar22 + 0x222d640 + lVar88 * 4);
            auVar119 = *(undefined1 (*) [32])(lVar22 + 0x222dac4 + lVar88 * 4);
            auVar118 = vmulps_avx512vl(local_4a0,auVar119);
            auVar117 = vmulps_avx512vl(local_4c0,auVar119);
            auVar119 = vmulps_avx512vl(local_1c0,auVar119);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar120,local_a0);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar120,local_c0);
            auVar120 = vfmadd231ps_avx512vl(auVar119,local_1a0,auVar120);
            auVar119 = vfmadd231ps_avx512vl(auVar118,auVar107,auVar174);
            auVar118 = vfmadd231ps_avx512vl(auVar117,auVar107,local_220);
            auVar107 = vfmadd231ps_avx512vl(auVar120,local_180,auVar107);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar109,auVar198);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,auVar162);
            auVar117 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
            auVar109 = *(undefined1 (*) [32])(lVar22 + 0x222f158 + lVar88 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar22 + 0x222fa60 + lVar88 * 4);
            auVar120 = *(undefined1 (*) [32])(lVar22 + 0x222fee4 + lVar88 * 4);
            auVar105 = vmulps_avx512vl(local_4a0,auVar120);
            auVar115 = vmulps_avx512vl(local_4c0,auVar120);
            auVar120 = vmulps_avx512vl(local_1c0,auVar120);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_a0);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar107,local_c0);
            auVar120 = vfmadd231ps_avx512vl(auVar120,local_1a0,auVar107);
            auVar107 = *(undefined1 (*) [32])(lVar22 + 0x222f5dc + lVar88 * 4);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar174);
            auVar103 = vfmadd231ps_fma(auVar115,auVar107,local_220);
            auVar107 = vfmadd231ps_avx512vl(auVar120,local_180,auVar107);
            auVar120 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar198);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar109,auVar162);
            auVar107 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar119,auVar115);
            vandps_avx512vl(auVar118,auVar115);
            auVar109 = vmaxps_avx(auVar115,auVar115);
            vandps_avx512vl(auVar117,auVar115);
            auVar109 = vmaxps_avx(auVar109,auVar115);
            uVar82 = vcmpps_avx512vl(auVar109,local_3e0,1);
            bVar14 = (bool)((byte)uVar82 & 1);
            auVar132._0_4_ = (float)((uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar119._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar119._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar119._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar119._12_4_);
            bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar14 * auVar112._16_4_ | (uint)!bVar14 * auVar119._16_4_);
            bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar14 * auVar112._20_4_ | (uint)!bVar14 * auVar119._20_4_);
            bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar14 * auVar112._24_4_ | (uint)!bVar14 * auVar119._24_4_);
            bVar14 = SUB81(uVar82 >> 7,0);
            auVar132._28_4_ = (uint)bVar14 * auVar112._28_4_ | (uint)!bVar14 * auVar119._28_4_;
            bVar14 = (bool)((byte)uVar82 & 1);
            auVar133._0_4_ = (float)((uint)bVar14 * auVar113._0_4_ | (uint)!bVar14 * auVar118._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar118._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar118._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar118._12_4_);
            bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar133._16_4_ =
                 (float)((uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar118._16_4_);
            bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar133._20_4_ =
                 (float)((uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar118._20_4_);
            bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar133._24_4_ =
                 (float)((uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar118._24_4_);
            bVar14 = SUB81(uVar82 >> 7,0);
            auVar133._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar118._28_4_;
            vandps_avx512vl(auVar120,auVar115);
            vandps_avx512vl(auVar105,auVar115);
            auVar109 = vmaxps_avx(auVar133,auVar133);
            vandps_avx512vl(auVar107,auVar115);
            auVar109 = vmaxps_avx(auVar109,auVar133);
            uVar82 = vcmpps_avx512vl(auVar109,local_3e0,1);
            bVar14 = (bool)((byte)uVar82 & 1);
            auVar134._0_4_ = (uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar120._0_4_;
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar120._4_4_;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar120._8_4_;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar120._12_4_;
            bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar134._16_4_ = (uint)bVar14 * auVar112._16_4_ | (uint)!bVar14 * auVar120._16_4_;
            bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar134._20_4_ = (uint)bVar14 * auVar112._20_4_ | (uint)!bVar14 * auVar120._20_4_;
            bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar134._24_4_ = (uint)bVar14 * auVar112._24_4_ | (uint)!bVar14 * auVar120._24_4_;
            bVar14 = SUB81(uVar82 >> 7,0);
            auVar134._28_4_ = (uint)bVar14 * auVar112._28_4_ | (uint)!bVar14 * auVar120._28_4_;
            bVar14 = (bool)((byte)uVar82 & 1);
            auVar135._0_4_ = (float)((uint)bVar14 * auVar113._0_4_ | (uint)!bVar14 * auVar105._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar105._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar105._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar105._12_4_);
            bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar135._16_4_ =
                 (float)((uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar105._16_4_);
            bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar135._20_4_ =
                 (float)((uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar105._20_4_);
            bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar135._24_4_ =
                 (float)((uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar105._24_4_);
            bVar14 = SUB81(uVar82 >> 7,0);
            auVar135._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar105._28_4_;
            auVar206._8_4_ = 0x80000000;
            auVar206._0_8_ = 0x8000000080000000;
            auVar206._12_4_ = 0x80000000;
            auVar206._16_4_ = 0x80000000;
            auVar206._20_4_ = 0x80000000;
            auVar206._24_4_ = 0x80000000;
            auVar206._28_4_ = 0x80000000;
            auVar109 = vxorps_avx512vl(auVar134,auVar206);
            auVar105 = auVar217._0_32_;
            auVar107 = vfmadd213ps_avx512vl(auVar132,auVar132,auVar105);
            auVar103 = vfmadd231ps_fma(auVar107,auVar133,auVar133);
            auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar103));
            auVar213._8_4_ = 0xbf000000;
            auVar213._0_8_ = 0xbf000000bf000000;
            auVar213._12_4_ = 0xbf000000;
            auVar213._16_4_ = 0xbf000000;
            auVar213._20_4_ = 0xbf000000;
            auVar213._24_4_ = 0xbf000000;
            auVar213._28_4_ = 0xbf000000;
            fVar176 = auVar107._0_4_;
            fVar152 = auVar107._4_4_;
            fVar193 = auVar107._8_4_;
            fVar194 = auVar107._12_4_;
            fVar195 = auVar107._16_4_;
            fVar180 = auVar107._20_4_;
            fVar94 = auVar107._24_4_;
            auVar57._4_4_ = fVar152 * fVar152 * fVar152 * auVar103._4_4_ * -0.5;
            auVar57._0_4_ = fVar176 * fVar176 * fVar176 * auVar103._0_4_ * -0.5;
            auVar57._8_4_ = fVar193 * fVar193 * fVar193 * auVar103._8_4_ * -0.5;
            auVar57._12_4_ = fVar194 * fVar194 * fVar194 * auVar103._12_4_ * -0.5;
            auVar57._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
            auVar57._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar57._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
            auVar57._28_4_ = auVar133._28_4_;
            auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar107 = vfmadd231ps_avx512vl(auVar57,auVar120,auVar107);
            auVar58._4_4_ = auVar133._4_4_ * auVar107._4_4_;
            auVar58._0_4_ = auVar133._0_4_ * auVar107._0_4_;
            auVar58._8_4_ = auVar133._8_4_ * auVar107._8_4_;
            auVar58._12_4_ = auVar133._12_4_ * auVar107._12_4_;
            auVar58._16_4_ = auVar133._16_4_ * auVar107._16_4_;
            auVar58._20_4_ = auVar133._20_4_ * auVar107._20_4_;
            auVar58._24_4_ = auVar133._24_4_ * auVar107._24_4_;
            auVar58._28_4_ = 0;
            auVar59._4_4_ = auVar107._4_4_ * -auVar132._4_4_;
            auVar59._0_4_ = auVar107._0_4_ * -auVar132._0_4_;
            auVar59._8_4_ = auVar107._8_4_ * -auVar132._8_4_;
            auVar59._12_4_ = auVar107._12_4_ * -auVar132._12_4_;
            auVar59._16_4_ = auVar107._16_4_ * -auVar132._16_4_;
            auVar59._20_4_ = auVar107._20_4_ * -auVar132._20_4_;
            auVar59._24_4_ = auVar107._24_4_ * -auVar132._24_4_;
            auVar59._28_4_ = auVar133._28_4_;
            auVar119 = vmulps_avx512vl(auVar107,auVar105);
            auVar107 = vfmadd213ps_avx512vl(auVar134,auVar134,auVar105);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar135,auVar135);
            auVar118 = vrsqrt14ps_avx512vl(auVar107);
            auVar107 = vmulps_avx512vl(auVar107,auVar213);
            fVar176 = auVar118._0_4_;
            fVar152 = auVar118._4_4_;
            fVar193 = auVar118._8_4_;
            fVar194 = auVar118._12_4_;
            fVar195 = auVar118._16_4_;
            fVar180 = auVar118._20_4_;
            fVar94 = auVar118._24_4_;
            auVar60._4_4_ = fVar152 * fVar152 * fVar152 * auVar107._4_4_;
            auVar60._0_4_ = fVar176 * fVar176 * fVar176 * auVar107._0_4_;
            auVar60._8_4_ = fVar193 * fVar193 * fVar193 * auVar107._8_4_;
            auVar60._12_4_ = fVar194 * fVar194 * fVar194 * auVar107._12_4_;
            auVar60._16_4_ = fVar195 * fVar195 * fVar195 * auVar107._16_4_;
            auVar60._20_4_ = fVar180 * fVar180 * fVar180 * auVar107._20_4_;
            auVar60._24_4_ = fVar94 * fVar94 * fVar94 * auVar107._24_4_;
            auVar60._28_4_ = auVar107._28_4_;
            auVar107 = vfmadd231ps_avx512vl(auVar60,auVar120,auVar118);
            auVar61._4_4_ = auVar135._4_4_ * auVar107._4_4_;
            auVar61._0_4_ = auVar135._0_4_ * auVar107._0_4_;
            auVar61._8_4_ = auVar135._8_4_ * auVar107._8_4_;
            auVar61._12_4_ = auVar135._12_4_ * auVar107._12_4_;
            auVar61._16_4_ = auVar135._16_4_ * auVar107._16_4_;
            auVar61._20_4_ = auVar135._20_4_ * auVar107._20_4_;
            auVar61._24_4_ = auVar135._24_4_ * auVar107._24_4_;
            auVar61._28_4_ = auVar118._28_4_;
            auVar62._4_4_ = auVar107._4_4_ * auVar109._4_4_;
            auVar62._0_4_ = auVar107._0_4_ * auVar109._0_4_;
            auVar62._8_4_ = auVar107._8_4_ * auVar109._8_4_;
            auVar62._12_4_ = auVar107._12_4_ * auVar109._12_4_;
            auVar62._16_4_ = auVar107._16_4_ * auVar109._16_4_;
            auVar62._20_4_ = auVar107._20_4_ * auVar109._20_4_;
            auVar62._24_4_ = auVar107._24_4_ * auVar109._24_4_;
            auVar62._28_4_ = auVar109._28_4_;
            auVar109 = vmulps_avx512vl(auVar107,auVar105);
            auVar103 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar98),auVar106);
            auVar107 = ZEXT1632(auVar98);
            auVar102 = vfmadd213ps_fma(auVar59,auVar107,auVar111);
            auVar120 = vfmadd213ps_avx512vl(auVar119,auVar107,auVar108);
            auVar118 = vfmadd213ps_avx512vl(auVar61,ZEXT1632(auVar96),auVar114);
            auVar9 = vfnmadd213ps_fma(auVar58,auVar107,auVar106);
            auVar117 = ZEXT1632(auVar96);
            auVar6 = vfmadd213ps_fma(auVar62,auVar117,auVar104);
            auVar164 = vfnmadd213ps_fma(auVar59,auVar107,auVar111);
            auVar7 = vfmadd213ps_fma(auVar109,auVar117,auVar110);
            auVar111 = ZEXT1632(auVar98);
            auVar100 = vfnmadd231ps_fma(auVar108,auVar111,auVar119);
            auVar165 = vfnmadd213ps_fma(auVar61,auVar117,auVar114);
            auVar99 = vfnmadd213ps_fma(auVar62,auVar117,auVar104);
            auVar204 = vfnmadd231ps_fma(auVar110,ZEXT1632(auVar96),auVar109);
            auVar110 = vsubps_avx512vl(auVar118,ZEXT1632(auVar9));
            auVar109 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar164));
            auVar107 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar100));
            auVar63._4_4_ = auVar109._4_4_ * auVar100._4_4_;
            auVar63._0_4_ = auVar109._0_4_ * auVar100._0_4_;
            auVar63._8_4_ = auVar109._8_4_ * auVar100._8_4_;
            auVar63._12_4_ = auVar109._12_4_ * auVar100._12_4_;
            auVar63._16_4_ = auVar109._16_4_ * 0.0;
            auVar63._20_4_ = auVar109._20_4_ * 0.0;
            auVar63._24_4_ = auVar109._24_4_ * 0.0;
            auVar63._28_4_ = auVar119._28_4_;
            auVar98 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar164),auVar107);
            auVar64._4_4_ = auVar107._4_4_ * auVar9._4_4_;
            auVar64._0_4_ = auVar107._0_4_ * auVar9._0_4_;
            auVar64._8_4_ = auVar107._8_4_ * auVar9._8_4_;
            auVar64._12_4_ = auVar107._12_4_ * auVar9._12_4_;
            auVar64._16_4_ = auVar107._16_4_ * 0.0;
            auVar64._20_4_ = auVar107._20_4_ * 0.0;
            auVar64._24_4_ = auVar107._24_4_ * 0.0;
            auVar64._28_4_ = auVar107._28_4_;
            auVar8 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar100),auVar110);
            auVar65._4_4_ = auVar164._4_4_ * auVar110._4_4_;
            auVar65._0_4_ = auVar164._0_4_ * auVar110._0_4_;
            auVar65._8_4_ = auVar164._8_4_ * auVar110._8_4_;
            auVar65._12_4_ = auVar164._12_4_ * auVar110._12_4_;
            auVar65._16_4_ = auVar110._16_4_ * 0.0;
            auVar65._20_4_ = auVar110._20_4_ * 0.0;
            auVar65._24_4_ = auVar110._24_4_ * 0.0;
            auVar65._28_4_ = auVar110._28_4_;
            auVar97 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar9),auVar109);
            auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar105,ZEXT1632(auVar8));
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,ZEXT1632(auVar98));
            uVar82 = vcmpps_avx512vl(auVar109,auVar105,2);
            bVar93 = (byte)uVar82;
            fVar144 = (float)((uint)(bVar93 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * auVar165._0_4_);
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            fVar146 = (float)((uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar165._4_4_);
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            fVar149 = (float)((uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar165._8_4_);
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            fVar150 = (float)((uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar165._12_4_);
            auVar117 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar149,CONCAT44(fVar146,fVar144))));
            fVar145 = (float)((uint)(bVar93 & 1) * auVar102._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * auVar99._0_4_);
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            fVar148 = (float)((uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar99._4_4_);
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            fVar147 = (float)((uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar99._8_4_);
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            fVar151 = (float)((uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar99._12_4_);
            auVar112 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar147,CONCAT44(fVar148,fVar145))));
            auVar136._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar120._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar204._0_4_);
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar204._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar204._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar204._12_4_);
            fVar176 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar120._16_4_);
            auVar136._16_4_ = fVar176;
            fVar152 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar120._20_4_);
            auVar136._20_4_ = fVar152;
            fVar193 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar120._24_4_);
            auVar136._24_4_ = fVar193;
            iVar1 = (uint)(byte)(uVar82 >> 7) * auVar120._28_4_;
            auVar136._28_4_ = iVar1;
            auVar109 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar118);
            auVar137._0_4_ =
                 (uint)(bVar93 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar98._0_4_;
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar98._4_4_;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar98._8_4_;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar98._12_4_;
            auVar137._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * auVar109._16_4_;
            auVar137._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * auVar109._20_4_;
            auVar137._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * auVar109._24_4_;
            auVar137._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar109._28_4_;
            auVar109 = vblendmps_avx512vl(ZEXT1632(auVar164),ZEXT1632(auVar6));
            auVar138._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar103._0_4_);
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar103._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar103._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar103._12_4_);
            fVar195 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar109._16_4_);
            auVar138._16_4_ = fVar195;
            fVar194 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar109._20_4_);
            auVar138._20_4_ = fVar194;
            fVar180 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar109._24_4_);
            auVar138._24_4_ = fVar180;
            auVar138._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar109._28_4_;
            auVar109 = vblendmps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar7));
            auVar139._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar102._0_4_);
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar102._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar102._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar102._12_4_);
            fVar94 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar109._16_4_);
            auVar139._16_4_ = fVar94;
            fVar95 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar109._20_4_);
            auVar139._20_4_ = fVar95;
            fVar175 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar109._24_4_);
            auVar139._24_4_ = fVar175;
            iVar2 = (uint)(byte)(uVar82 >> 7) * auVar109._28_4_;
            auVar139._28_4_ = iVar2;
            auVar140._0_4_ =
                 (uint)(bVar93 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar118._0_4_
            ;
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar14 * (int)auVar9._4_4_ | (uint)!bVar14 * auVar118._4_4_;
            bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar14 * (int)auVar9._8_4_ | (uint)!bVar14 * auVar118._8_4_;
            bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar14 * (int)auVar9._12_4_ | (uint)!bVar14 * auVar118._12_4_;
            auVar140._16_4_ = (uint)!(bool)((byte)(uVar82 >> 4) & 1) * auVar118._16_4_;
            auVar140._20_4_ = (uint)!(bool)((byte)(uVar82 >> 5) & 1) * auVar118._20_4_;
            auVar140._24_4_ = (uint)!(bool)((byte)(uVar82 >> 6) & 1) * auVar118._24_4_;
            auVar140._28_4_ = (uint)!SUB81(uVar82 >> 7,0) * auVar118._28_4_;
            bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar82 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar82 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar82 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar118 = vsubps_avx512vl(auVar140,auVar117);
            auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar164._12_4_ |
                                                     (uint)!bVar18 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar164._8_4_ |
                                                              (uint)!bVar16 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar164._4_4_ |
                                                                       (uint)!bVar14 * auVar6._4_4_,
                                                                       (uint)(bVar93 & 1) *
                                                                       (int)auVar164._0_4_ |
                                                                       (uint)!(bool)(bVar93 & 1) *
                                                                       auVar6._0_4_)))),auVar112);
            auVar120 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar100._12_4_ |
                                                     (uint)!bVar19 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar100._8_4_ |
                                                              (uint)!bVar17 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar100._4_4_ |
                                                                       (uint)!bVar15 * auVar7._4_4_,
                                                                       (uint)(bVar93 & 1) *
                                                                       (int)auVar100._0_4_ |
                                                                       (uint)!(bool)(bVar93 & 1) *
                                                                       auVar7._0_4_)))),auVar136);
            auVar119 = vsubps_avx(auVar117,auVar137);
            auVar110 = vsubps_avx(auVar112,auVar138);
            auVar108 = vsubps_avx(auVar136,auVar139);
            auVar66._4_4_ = auVar120._4_4_ * fVar146;
            auVar66._0_4_ = auVar120._0_4_ * fVar144;
            auVar66._8_4_ = auVar120._8_4_ * fVar149;
            auVar66._12_4_ = auVar120._12_4_ * fVar150;
            auVar66._16_4_ = auVar120._16_4_ * 0.0;
            auVar66._20_4_ = auVar120._20_4_ * 0.0;
            auVar66._24_4_ = auVar120._24_4_ * 0.0;
            auVar66._28_4_ = 0;
            auVar98 = vfmsub231ps_fma(auVar66,auVar136,auVar118);
            auVar178._0_4_ = fVar145 * auVar118._0_4_;
            auVar178._4_4_ = fVar148 * auVar118._4_4_;
            auVar178._8_4_ = fVar147 * auVar118._8_4_;
            auVar178._12_4_ = fVar151 * auVar118._12_4_;
            auVar178._16_4_ = auVar118._16_4_ * 0.0;
            auVar178._20_4_ = auVar118._20_4_ * 0.0;
            auVar178._24_4_ = auVar118._24_4_ * 0.0;
            auVar178._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar178,auVar117,auVar107);
            auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar105,ZEXT1632(auVar98));
            auVar191._0_4_ = auVar107._0_4_ * auVar136._0_4_;
            auVar191._4_4_ = auVar107._4_4_ * auVar136._4_4_;
            auVar191._8_4_ = auVar107._8_4_ * auVar136._8_4_;
            auVar191._12_4_ = auVar107._12_4_ * auVar136._12_4_;
            auVar191._16_4_ = auVar107._16_4_ * fVar176;
            auVar191._20_4_ = auVar107._20_4_ * fVar152;
            auVar191._24_4_ = auVar107._24_4_ * fVar193;
            auVar191._28_4_ = 0;
            auVar98 = vfmsub231ps_fma(auVar191,auVar112,auVar120);
            auVar113 = vfmadd231ps_avx512vl(auVar109,auVar105,ZEXT1632(auVar98));
            auVar109 = vmulps_avx512vl(auVar108,auVar137);
            auVar109 = vfmsub231ps_avx512vl(auVar109,auVar119,auVar139);
            auVar67._4_4_ = auVar110._4_4_ * auVar139._4_4_;
            auVar67._0_4_ = auVar110._0_4_ * auVar139._0_4_;
            auVar67._8_4_ = auVar110._8_4_ * auVar139._8_4_;
            auVar67._12_4_ = auVar110._12_4_ * auVar139._12_4_;
            auVar67._16_4_ = auVar110._16_4_ * fVar94;
            auVar67._20_4_ = auVar110._20_4_ * fVar95;
            auVar67._24_4_ = auVar110._24_4_ * fVar175;
            auVar67._28_4_ = iVar2;
            auVar98 = vfmsub231ps_fma(auVar67,auVar138,auVar108);
            auVar192._0_4_ = auVar138._0_4_ * auVar119._0_4_;
            auVar192._4_4_ = auVar138._4_4_ * auVar119._4_4_;
            auVar192._8_4_ = auVar138._8_4_ * auVar119._8_4_;
            auVar192._12_4_ = auVar138._12_4_ * auVar119._12_4_;
            auVar192._16_4_ = fVar195 * auVar119._16_4_;
            auVar192._20_4_ = fVar194 * auVar119._20_4_;
            auVar192._24_4_ = fVar180 * auVar119._24_4_;
            auVar192._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar192,auVar110,auVar137);
            auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar105,auVar109);
            auVar106 = vfmadd231ps_avx512vl(auVar109,auVar105,ZEXT1632(auVar98));
            auVar109 = vmaxps_avx(auVar113,auVar106);
            uVar154 = vcmpps_avx512vl(auVar109,auVar105,2);
            local_2d0 = local_2d0 & (byte)uVar154;
            if (local_2d0 == 0) {
LAB_01d4eb68:
              local_2d0 = 0;
            }
            else {
              auVar68._4_4_ = auVar108._4_4_ * auVar107._4_4_;
              auVar68._0_4_ = auVar108._0_4_ * auVar107._0_4_;
              auVar68._8_4_ = auVar108._8_4_ * auVar107._8_4_;
              auVar68._12_4_ = auVar108._12_4_ * auVar107._12_4_;
              auVar68._16_4_ = auVar108._16_4_ * auVar107._16_4_;
              auVar68._20_4_ = auVar108._20_4_ * auVar107._20_4_;
              auVar68._24_4_ = auVar108._24_4_ * auVar107._24_4_;
              auVar68._28_4_ = auVar109._28_4_;
              auVar102 = vfmsub231ps_fma(auVar68,auVar110,auVar120);
              auVar69._4_4_ = auVar120._4_4_ * auVar119._4_4_;
              auVar69._0_4_ = auVar120._0_4_ * auVar119._0_4_;
              auVar69._8_4_ = auVar120._8_4_ * auVar119._8_4_;
              auVar69._12_4_ = auVar120._12_4_ * auVar119._12_4_;
              auVar69._16_4_ = auVar120._16_4_ * auVar119._16_4_;
              auVar69._20_4_ = auVar120._20_4_ * auVar119._20_4_;
              auVar69._24_4_ = auVar120._24_4_ * auVar119._24_4_;
              auVar69._28_4_ = auVar120._28_4_;
              auVar103 = vfmsub231ps_fma(auVar69,auVar118,auVar108);
              auVar70._4_4_ = auVar110._4_4_ * auVar118._4_4_;
              auVar70._0_4_ = auVar110._0_4_ * auVar118._0_4_;
              auVar70._8_4_ = auVar110._8_4_ * auVar118._8_4_;
              auVar70._12_4_ = auVar110._12_4_ * auVar118._12_4_;
              auVar70._16_4_ = auVar110._16_4_ * auVar118._16_4_;
              auVar70._20_4_ = auVar110._20_4_ * auVar118._20_4_;
              auVar70._24_4_ = auVar110._24_4_ * auVar118._24_4_;
              auVar70._28_4_ = auVar110._28_4_;
              auVar6 = vfmsub231ps_fma(auVar70,auVar119,auVar107);
              auVar98 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar6));
              auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar102),auVar105);
              auVar107 = vrcp14ps_avx512vl(auVar109);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = &DAT_3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar32._16_4_ = 0x3f800000;
              auVar32._20_4_ = 0x3f800000;
              auVar32._24_4_ = 0x3f800000;
              auVar32._28_4_ = 0x3f800000;
              auVar120 = vfnmadd213ps_avx512vl(auVar107,auVar109,auVar32);
              auVar98 = vfmadd132ps_fma(auVar120,auVar107,auVar107);
              auVar71._4_4_ = auVar6._4_4_ * auVar136._4_4_;
              auVar71._0_4_ = auVar6._0_4_ * auVar136._0_4_;
              auVar71._8_4_ = auVar6._8_4_ * auVar136._8_4_;
              auVar71._12_4_ = auVar6._12_4_ * auVar136._12_4_;
              auVar71._16_4_ = fVar176 * 0.0;
              auVar71._20_4_ = fVar152 * 0.0;
              auVar71._24_4_ = fVar193 * 0.0;
              auVar71._28_4_ = iVar1;
              auVar103 = vfmadd231ps_fma(auVar71,auVar112,ZEXT1632(auVar103));
              auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar117,ZEXT1632(auVar102));
              fVar152 = auVar98._0_4_;
              fVar193 = auVar98._4_4_;
              fVar194 = auVar98._8_4_;
              fVar195 = auVar98._12_4_;
              auVar107 = ZEXT1632(CONCAT412(auVar103._12_4_ * fVar195,
                                            CONCAT48(auVar103._8_4_ * fVar194,
                                                     CONCAT44(auVar103._4_4_ * fVar193,
                                                              auVar103._0_4_ * fVar152))));
              auVar77._4_4_ = uStack_3fc;
              auVar77._0_4_ = local_400;
              auVar77._8_4_ = uStack_3f8;
              auVar77._12_4_ = uStack_3f4;
              auVar77._16_4_ = uStack_3f0;
              auVar77._20_4_ = uStack_3ec;
              auVar77._24_4_ = uStack_3e8;
              auVar77._28_4_ = uStack_3e4;
              uVar154 = vcmpps_avx512vl(auVar107,auVar77,0xd);
              fVar176 = (ray->super_RayK<1>).tfar;
              auVar33._4_4_ = fVar176;
              auVar33._0_4_ = fVar176;
              auVar33._8_4_ = fVar176;
              auVar33._12_4_ = fVar176;
              auVar33._16_4_ = fVar176;
              auVar33._20_4_ = fVar176;
              auVar33._24_4_ = fVar176;
              auVar33._28_4_ = fVar176;
              uVar21 = vcmpps_avx512vl(auVar107,auVar33,2);
              local_2d0 = (byte)uVar154 & (byte)uVar21 & local_2d0;
              if (local_2d0 == 0) goto LAB_01d4eb68;
              uVar154 = vcmpps_avx512vl(auVar109,auVar105,4);
              if ((local_2d0 & (byte)uVar154) == 0) {
                local_2d0 = 0;
              }
              else {
                local_2d0 = local_2d0 & (byte)uVar154;
                fVar176 = auVar113._0_4_ * fVar152;
                fVar180 = auVar113._4_4_ * fVar193;
                auVar72._4_4_ = fVar180;
                auVar72._0_4_ = fVar176;
                fVar94 = auVar113._8_4_ * fVar194;
                auVar72._8_4_ = fVar94;
                fVar95 = auVar113._12_4_ * fVar195;
                auVar72._12_4_ = fVar95;
                fVar175 = auVar113._16_4_ * 0.0;
                auVar72._16_4_ = fVar175;
                fVar144 = auVar113._20_4_ * 0.0;
                auVar72._20_4_ = fVar144;
                fVar145 = auVar113._24_4_ * 0.0;
                auVar72._24_4_ = fVar145;
                auVar72._28_4_ = auVar113._28_4_;
                fVar152 = auVar106._0_4_ * fVar152;
                fVar193 = auVar106._4_4_ * fVar193;
                auVar73._4_4_ = fVar193;
                auVar73._0_4_ = fVar152;
                fVar194 = auVar106._8_4_ * fVar194;
                auVar73._8_4_ = fVar194;
                fVar195 = auVar106._12_4_ * fVar195;
                auVar73._12_4_ = fVar195;
                fVar146 = auVar106._16_4_ * 0.0;
                auVar73._16_4_ = fVar146;
                fVar148 = auVar106._20_4_ * 0.0;
                auVar73._20_4_ = fVar148;
                fVar149 = auVar106._24_4_ * 0.0;
                auVar73._24_4_ = fVar149;
                auVar73._28_4_ = auVar106._28_4_;
                auVar197._8_4_ = 0x3f800000;
                auVar197._0_8_ = &DAT_3f8000003f800000;
                auVar197._12_4_ = 0x3f800000;
                auVar197._16_4_ = 0x3f800000;
                auVar197._20_4_ = 0x3f800000;
                auVar197._24_4_ = 0x3f800000;
                auVar197._28_4_ = 0x3f800000;
                auVar109 = vsubps_avx512vl(auVar197,auVar72);
                bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar82 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar82 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar82 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar82 >> 6) & 1);
                bVar20 = SUB81(uVar82 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar20 * auVar113._28_4_ |
                                              (uint)!bVar20 * auVar109._28_4_,
                                              CONCAT424((uint)bVar19 * (int)fVar145 |
                                                        (uint)!bVar19 * auVar109._24_4_,
                                                        CONCAT420((uint)bVar18 * (int)fVar144 |
                                                                  (uint)!bVar18 * auVar109._20_4_,
                                                                  CONCAT416((uint)bVar17 *
                                                                            (int)fVar175 |
                                                                            (uint)!bVar17 *
                                                                            auVar109._16_4_,
                                                                            CONCAT412((uint)bVar16 *
                                                                                      (int)fVar95 |
                                                                                      (uint)!bVar16
                                                                                      * auVar109.
                                                  _12_4_,CONCAT48((uint)bVar15 * (int)fVar94 |
                                                                  (uint)!bVar15 * auVar109._8_4_,
                                                                  CONCAT44((uint)bVar14 *
                                                                           (int)fVar180 |
                                                                           (uint)!bVar14 *
                                                                           auVar109._4_4_,
                                                                           (uint)(bVar93 & 1) *
                                                                           (int)fVar176 |
                                                                           (uint)!(bool)(bVar93 & 1)
                                                                           * auVar109._0_4_))))))));
                auVar109 = vsubps_avx(auVar197,auVar73);
                bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar82 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar82 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar82 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar82 >> 6) & 1);
                bVar20 = SUB81(uVar82 >> 7,0);
                local_260._4_4_ = (uint)bVar14 * (int)fVar193 | (uint)!bVar14 * auVar109._4_4_;
                local_260._0_4_ =
                     (uint)(bVar93 & 1) * (int)fVar152 | (uint)!(bool)(bVar93 & 1) * auVar109._0_4_;
                local_260._8_4_ = (uint)bVar15 * (int)fVar194 | (uint)!bVar15 * auVar109._8_4_;
                local_260._12_4_ = (uint)bVar16 * (int)fVar195 | (uint)!bVar16 * auVar109._12_4_;
                local_260._16_4_ = (uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar109._16_4_;
                local_260._20_4_ = (uint)bVar18 * (int)fVar148 | (uint)!bVar18 * auVar109._20_4_;
                local_260._24_4_ = (uint)bVar19 * (int)fVar149 | (uint)!bVar19 * auVar109._24_4_;
                local_260._28_4_ = (uint)bVar20 * auVar106._28_4_ | (uint)!bVar20 * auVar109._28_4_;
                in_ZMM21 = ZEXT3264(auVar107);
              }
            }
            auVar215 = ZEXT3264(local_540);
            auVar214 = ZEXT3264(local_520);
            auVar218 = ZEXT1664(local_620);
            auVar200 = ZEXT3264(local_5a0);
            auVar179 = ZEXT3264(local_600);
            if (local_2d0 != 0) {
              auVar109 = vsubps_avx(ZEXT1632(auVar96),auVar111);
              local_380 = in_ZMM20._0_32_;
              auVar109 = vfmadd213ps_avx512vl(auVar109,local_380,auVar111);
              auVar157._0_4_ = auVar109._0_4_ + auVar109._0_4_;
              auVar157._4_4_ = auVar109._4_4_ + auVar109._4_4_;
              auVar157._8_4_ = auVar109._8_4_ + auVar109._8_4_;
              auVar157._12_4_ = auVar109._12_4_ + auVar109._12_4_;
              auVar157._16_4_ = auVar109._16_4_ + auVar109._16_4_;
              auVar157._20_4_ = auVar109._20_4_ + auVar109._20_4_;
              auVar157._24_4_ = auVar109._24_4_ + auVar109._24_4_;
              auVar157._28_4_ = auVar109._28_4_ + auVar109._28_4_;
              fVar176 = pre->depth_scale;
              auVar34._4_4_ = fVar176;
              auVar34._0_4_ = fVar176;
              auVar34._8_4_ = fVar176;
              auVar34._12_4_ = fVar176;
              auVar34._16_4_ = fVar176;
              auVar34._20_4_ = fVar176;
              auVar34._24_4_ = fVar176;
              auVar34._28_4_ = fVar176;
              auVar109 = vmulps_avx512vl(auVar157,auVar34);
              local_340 = in_ZMM21._0_32_;
              uVar154 = vcmpps_avx512vl(local_340,auVar109,6);
              local_2d0 = local_2d0 & (byte)uVar154;
              if (local_2d0 != 0) {
                auVar158._8_4_ = 0xbf800000;
                auVar158._0_8_ = 0xbf800000bf800000;
                auVar158._12_4_ = 0xbf800000;
                auVar158._16_4_ = 0xbf800000;
                auVar158._20_4_ = 0xbf800000;
                auVar158._24_4_ = 0xbf800000;
                auVar158._28_4_ = 0xbf800000;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_260 = vfmadd132ps_avx512vl(local_260,auVar158,auVar35);
                auVar109 = local_260;
                local_360 = local_260;
                local_320 = (int)lVar88;
                local_31c = iVar11;
                local_310 = local_620;
                local_300 = local_4d0._0_8_;
                uStack_2f8 = local_4d0._8_8_;
                local_2f0 = local_4e0._0_8_;
                uStack_2e8 = local_4e0._8_8_;
                local_2e0 = local_4f0;
                uStack_2d8 = uStack_4e8;
                pGVar12 = (context->scene->geometries).items[local_628].ptr;
                local_610._0_8_ = pGVar12;
                local_260 = auVar109;
                if ((pGVar12->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar107 = vaddps_avx512vl(local_380,_DAT_02020f40);
                  auVar98 = vcvtsi2ss_avx512f(auVar216._0_16_,(int)lVar88);
                  fVar176 = auVar98._0_4_;
                  local_2c0[0] = (fVar176 + auVar107._0_4_) * (float)local_3a0._0_4_;
                  local_2c0[1] = (fVar176 + auVar107._4_4_) * (float)local_3a0._4_4_;
                  local_2c0[2] = (fVar176 + auVar107._8_4_) * fStack_398;
                  local_2c0[3] = (fVar176 + auVar107._12_4_) * fStack_394;
                  fStack_2b0 = (fVar176 + auVar107._16_4_) * fStack_390;
                  fStack_2ac = (fVar176 + auVar107._20_4_) * fStack_38c;
                  fStack_2a8 = (fVar176 + auVar107._24_4_) * fStack_388;
                  fStack_2a4 = fVar176 + auVar107._28_4_;
                  local_2a0 = local_260._0_8_;
                  uStack_298 = local_260._8_8_;
                  uStack_290 = local_260._16_8_;
                  uStack_288 = local_260._24_8_;
                  local_280 = local_340;
                  auVar159._8_4_ = 0x7f800000;
                  auVar159._0_8_ = 0x7f8000007f800000;
                  auVar159._12_4_ = 0x7f800000;
                  auVar159._16_4_ = 0x7f800000;
                  auVar159._20_4_ = 0x7f800000;
                  auVar159._24_4_ = 0x7f800000;
                  auVar159._28_4_ = 0x7f800000;
                  auVar107 = vblendmps_avx512vl(auVar159,local_340);
                  auVar141._0_4_ =
                       (uint)(local_2d0 & 1) * auVar107._0_4_ |
                       (uint)!(bool)(local_2d0 & 1) * 0x7f800000;
                  bVar14 = (bool)(local_2d0 >> 1 & 1);
                  auVar141._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_2d0 >> 2 & 1);
                  auVar141._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_2d0 >> 3 & 1);
                  auVar141._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_2d0 >> 4 & 1);
                  auVar141._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_2d0 >> 5 & 1);
                  auVar141._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_2d0 >> 6 & 1);
                  auVar141._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar141._28_4_ =
                       (uint)(local_2d0 >> 7) * auVar107._28_4_ |
                       (uint)!(bool)(local_2d0 >> 7) * 0x7f800000;
                  auVar107 = vshufps_avx(auVar141,auVar141,0xb1);
                  auVar107 = vminps_avx(auVar141,auVar107);
                  auVar120 = vshufpd_avx(auVar107,auVar107,5);
                  auVar107 = vminps_avx(auVar107,auVar120);
                  auVar120 = vpermpd_avx2(auVar107,0x4e);
                  auVar107 = vminps_avx(auVar107,auVar120);
                  uVar154 = vcmpps_avx512vl(auVar141,auVar107,0);
                  bVar81 = (byte)uVar154 & local_2d0;
                  local_580 = (uint)local_2d0;
                  bVar93 = local_2d0;
                  if (bVar81 != 0) {
                    bVar93 = bVar81;
                  }
                  uVar85 = 0;
                  for (uVar84 = (uint)bVar93; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000)
                  {
                    uVar85 = uVar85 + 1;
                  }
                  uVar82 = (ulong)uVar85;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar176 = local_2c0[uVar82];
                    fVar152 = *(float *)((long)&local_2a0 + uVar82 * 4);
                    fVar193 = 1.0 - fVar176;
                    auVar24._8_4_ = 0x80000000;
                    auVar24._0_8_ = 0x8000000080000000;
                    auVar24._12_4_ = 0x80000000;
                    auVar103 = vxorps_avx512vl(ZEXT416((uint)fVar193),auVar24);
                    auVar98 = ZEXT416((uint)(fVar176 * fVar193 * 4.0));
                    auVar96 = vfnmsub213ss_fma(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),auVar98
                                              );
                    auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),auVar98)
                    ;
                    fVar193 = fVar193 * auVar103._0_4_ * 0.5;
                    fVar194 = auVar96._0_4_ * 0.5;
                    fVar195 = auVar98._0_4_ * 0.5;
                    fVar180 = fVar176 * fVar176 * 0.5;
                    auVar183._0_4_ = fVar180 * (float)local_4f0._0_4_;
                    auVar183._4_4_ = fVar180 * (float)local_4f0._4_4_;
                    auVar183._8_4_ = fVar180 * (float)uStack_4e8;
                    auVar183._12_4_ = fVar180 * uStack_4e8._4_4_;
                    auVar168._4_4_ = fVar195;
                    auVar168._0_4_ = fVar195;
                    auVar168._8_4_ = fVar195;
                    auVar168._12_4_ = fVar195;
                    auVar98 = vfmadd132ps_fma(auVar168,auVar183,local_4e0);
                    auVar184._4_4_ = fVar194;
                    auVar184._0_4_ = fVar194;
                    auVar184._8_4_ = fVar194;
                    auVar184._12_4_ = fVar194;
                    auVar98 = vfmadd132ps_fma(auVar184,auVar98,local_4d0);
                    auVar169._4_4_ = fVar193;
                    auVar169._0_4_ = fVar193;
                    auVar169._8_4_ = fVar193;
                    auVar169._12_4_ = fVar193;
                    (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar82 * 4);
                    auVar98 = vfmadd213ps_fma(auVar169,local_620,auVar98);
                    uVar154 = vmovlps_avx(auVar98);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar154;
                    fVar193 = (float)vextractps_avx(auVar98,2);
                    (ray->Ng).field_0.field_0.z = fVar193;
                    ray->u = fVar176;
                    ray->v = fVar152;
                    ray->primID = uVar91;
                    ray->geomID = (uint)local_628;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    auVar200 = ZEXT3264(local_5a0);
                    auVar179 = ZEXT3264(local_600);
                  }
                  else {
                    local_1d0 = local_4d0._0_8_;
                    uStack_1c8 = local_4d0._8_8_;
                    local_1e0 = local_4e0._0_8_;
                    uStack_1d8 = local_4e0._8_8_;
                    local_1f0 = local_4f0;
                    uStack_1e8 = uStack_4e8;
                    local_460 = local_380;
                    local_480 = local_340;
                    local_630 = pPVar90;
                    local_638 = context;
                    local_640 = ray;
                    local_648 = pre;
                    do {
                      auVar102 = auVar217._0_16_;
                      local_564 = local_2c0[uVar82];
                      local_560 = *(undefined4 *)((long)&local_2a0 + uVar82 * 4);
                      local_440 = CONCAT44(local_440._4_4_,(ray->super_RayK<1>).tfar);
                      (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar82 * 4);
                      local_430 = context->user;
                      fVar176 = 1.0 - local_564;
                      auVar25._8_4_ = 0x80000000;
                      auVar25._0_8_ = 0x8000000080000000;
                      auVar25._12_4_ = 0x80000000;
                      auVar103 = vxorps_avx512vl(ZEXT416((uint)fVar176),auVar25);
                      auVar98 = ZEXT416((uint)(local_564 * fVar176 * 4.0));
                      auVar96 = vfnmsub213ss_fma(ZEXT416((uint)local_564),ZEXT416((uint)local_564),
                                                 auVar98);
                      auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),
                                                auVar98);
                      fVar176 = fVar176 * auVar103._0_4_ * 0.5;
                      fVar152 = auVar96._0_4_ * 0.5;
                      fVar193 = auVar98._0_4_ * 0.5;
                      fVar194 = local_564 * local_564 * 0.5;
                      auVar185._0_4_ = fVar194 * (float)local_1f0;
                      auVar185._4_4_ = fVar194 * local_1f0._4_4_;
                      auVar185._8_4_ = fVar194 * (float)uStack_1e8;
                      auVar185._12_4_ = fVar194 * uStack_1e8._4_4_;
                      auVar170._4_4_ = fVar193;
                      auVar170._0_4_ = fVar193;
                      auVar170._8_4_ = fVar193;
                      auVar170._12_4_ = fVar193;
                      auVar78._8_8_ = uStack_1d8;
                      auVar78._0_8_ = local_1e0;
                      auVar98 = vfmadd132ps_fma(auVar170,auVar185,auVar78);
                      auVar186._4_4_ = fVar152;
                      auVar186._0_4_ = fVar152;
                      auVar186._8_4_ = fVar152;
                      auVar186._12_4_ = fVar152;
                      auVar79._8_8_ = uStack_1c8;
                      auVar79._0_8_ = local_1d0;
                      auVar98 = vfmadd132ps_fma(auVar186,auVar98,auVar79);
                      auVar171._4_4_ = fVar176;
                      auVar171._0_4_ = fVar176;
                      auVar171._8_4_ = fVar176;
                      auVar171._12_4_ = fVar176;
                      auVar98 = vfmadd213ps_fma(auVar171,auVar218._0_16_,auVar98);
                      local_570 = vmovlps_avx(auVar98);
                      local_568 = vextractps_avx(auVar98,2);
                      local_55c = uVar91;
                      local_558 = (int)local_628;
                      local_554 = local_430->instID[0];
                      local_550 = local_430->instPrimID[0];
                      local_64c = -1;
                      local_5d0.valid = &local_64c;
                      local_5d0.geometryUserPtr = *(void **)(local_610._0_8_ + 0x18);
                      local_5d0.context = local_430;
                      local_5d0.ray = (RTCRayN *)ray;
                      local_5d0.hit = (RTCHitN *)&local_570;
                      local_5d0.N = 1;
                      if (*(code **)(local_610._0_8_ + 0x40) == (code *)0x0) {
LAB_01d4ee1d:
                        auVar98 = auVar217._0_16_;
                        p_Var13 = context->args->filter;
                        if (p_Var13 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_610._0_8_ + 0x3e) & 0x40) != 0)) {
                            (*p_Var13)(&local_5d0);
                            auVar220 = ZEXT3264(local_4c0);
                            auVar219 = ZEXT3264(local_4a0);
                            auVar215 = ZEXT3264(local_540);
                            auVar214 = ZEXT3264(local_520);
                            auVar216 = ZEXT3264(local_420);
                            auVar218 = ZEXT1664(local_620);
                            in_ZMM21 = ZEXT3264(local_480);
                            in_ZMM20 = ZEXT3264(local_460);
                            auVar98 = vxorps_avx512vl(auVar98,auVar98);
                            auVar217 = ZEXT1664(auVar98);
                            ray = local_640;
                            pre = local_648;
                            pPVar90 = local_630;
                            context = local_638;
                          }
                          if (*local_5d0.valid == 0) goto LAB_01d4ef21;
                        }
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5d0.hit;
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5d0.hit + 4);
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5d0.hit + 8);
                        *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
                        *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
                        *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
                        *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
                        *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
                        *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
                      }
                      else {
                        (**(code **)(local_610._0_8_ + 0x40))(&local_5d0);
                        auVar220 = ZEXT3264(local_4c0);
                        auVar219 = ZEXT3264(local_4a0);
                        auVar215 = ZEXT3264(local_540);
                        auVar214 = ZEXT3264(local_520);
                        auVar216 = ZEXT3264(local_420);
                        auVar218 = ZEXT1664(local_620);
                        in_ZMM21 = ZEXT3264(local_480);
                        in_ZMM20 = ZEXT3264(local_460);
                        auVar98 = vxorps_avx512vl(auVar102,auVar102);
                        auVar217 = ZEXT1664(auVar98);
                        ray = local_640;
                        pre = local_648;
                        pPVar90 = local_630;
                        context = local_638;
                        if (*local_5d0.valid != 0) goto LAB_01d4ee1d;
LAB_01d4ef21:
                        (ray->super_RayK<1>).tfar = (float)local_440;
                      }
                      bVar81 = ~(byte)(1 << ((uint)uVar82 & 0x1f)) & (byte)local_580;
                      fVar176 = (ray->super_RayK<1>).tfar;
                      auVar36._4_4_ = fVar176;
                      auVar36._0_4_ = fVar176;
                      auVar36._8_4_ = fVar176;
                      auVar36._12_4_ = fVar176;
                      auVar36._16_4_ = fVar176;
                      auVar36._20_4_ = fVar176;
                      auVar36._24_4_ = fVar176;
                      auVar36._28_4_ = fVar176;
                      uVar154 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar36,2);
                      bVar93 = bVar81 & (byte)uVar154;
                      local_580 = (uint)bVar93;
                      auVar200 = ZEXT3264(local_5a0);
                      auVar179 = ZEXT3264(local_600);
                      if ((bVar81 & (byte)uVar154) != 0) {
                        auVar160._8_4_ = 0x7f800000;
                        auVar160._0_8_ = 0x7f8000007f800000;
                        auVar160._12_4_ = 0x7f800000;
                        auVar160._16_4_ = 0x7f800000;
                        auVar160._20_4_ = 0x7f800000;
                        auVar160._24_4_ = 0x7f800000;
                        auVar160._28_4_ = 0x7f800000;
                        auVar109 = vblendmps_avx512vl(auVar160,in_ZMM21._0_32_);
                        auVar142._0_4_ =
                             (uint)(bVar93 & 1) * auVar109._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar93 >> 1 & 1);
                        auVar142._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar93 >> 2 & 1);
                        auVar142._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar93 >> 3 & 1);
                        auVar142._12_4_ =
                             (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar93 >> 4 & 1);
                        auVar142._16_4_ =
                             (uint)bVar14 * auVar109._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar93 >> 5 & 1);
                        auVar142._20_4_ =
                             (uint)bVar14 * auVar109._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar93 >> 6 & 1);
                        auVar142._24_4_ =
                             (uint)bVar14 * auVar109._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar142._28_4_ =
                             (uint)(bVar93 >> 7) * auVar109._28_4_ |
                             (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                        auVar109 = vshufps_avx(auVar142,auVar142,0xb1);
                        auVar109 = vminps_avx(auVar142,auVar109);
                        auVar107 = vshufpd_avx(auVar109,auVar109,5);
                        auVar109 = vminps_avx(auVar109,auVar107);
                        auVar107 = vpermpd_avx2(auVar109,0x4e);
                        auVar109 = vminps_avx(auVar109,auVar107);
                        uVar154 = vcmpps_avx512vl(auVar142,auVar109,0);
                        bVar81 = (byte)uVar154 & bVar93;
                        uVar85 = local_580;
                        if (bVar81 != 0) {
                          uVar85 = (uint)bVar81;
                        }
                        uVar84 = 0;
                        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                          uVar84 = uVar84 + 1;
                        }
                        uVar82 = (ulong)uVar84;
                      }
                    } while (bVar93 != 0);
                  }
                }
              }
            }
          }
          lVar88 = lVar88 + 8;
        } while ((int)lVar88 < iVar11);
      }
      fVar176 = (ray->super_RayK<1>).tfar;
      auVar31._4_4_ = fVar176;
      auVar31._0_4_ = fVar176;
      auVar31._8_4_ = fVar176;
      auVar31._12_4_ = fVar176;
      auVar31._16_4_ = fVar176;
      auVar31._20_4_ = fVar176;
      auVar31._24_4_ = fVar176;
      auVar31._28_4_ = fVar176;
      uVar154 = vcmpps_avx512vl(local_80,auVar31,2);
      uVar91 = (uint)uVar92 & (uint)uVar154;
      uVar92 = (ulong)uVar91;
    } while (uVar91 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }